

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx2::CurveNiMBIntersectorK<8,4>::
     intersect_h<embree::avx2::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,8>,embree::avx2::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  undefined1 (*pauVar2) [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Primitive PVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  undefined4 uVar16;
  __int_type_conflict _Var17;
  long lVar18;
  long lVar19;
  RTCFilterFunctionN p_Var20;
  undefined1 auVar21 [32];
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  undefined1 auVar89 [32];
  undefined1 auVar90 [28];
  uint uVar91;
  uint uVar92;
  ulong uVar93;
  uint uVar94;
  long lVar95;
  ulong uVar96;
  long lVar97;
  Geometry *pGVar98;
  undefined4 uVar99;
  undefined8 uVar100;
  float fVar117;
  undefined1 auVar101 [16];
  float fVar115;
  undefined1 auVar102 [16];
  float fVar119;
  float fVar120;
  float fVar121;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  float fVar116;
  float fVar118;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar122 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar123 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar140;
  float fVar141;
  undefined1 auVar142 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar156 [32];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [64];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar197;
  float fVar203;
  float fVar204;
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [64];
  undefined1 auVar205 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar206 [64];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [64];
  float fVar210;
  float fVar214;
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [64];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [64];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [64];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined1 local_8a0 [32];
  undefined1 local_880 [16];
  undefined1 auStack_870 [16];
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined1 local_7e0 [16];
  Primitive *local_7d0;
  Precalculations *local_7c8;
  undefined1 local_7c0 [32];
  RTCFilterFunctionNArguments local_790;
  undefined1 local_760 [32];
  undefined1 local_740 [56];
  undefined1 (*local_708) [16];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_690 [8];
  uint uStack_688;
  uint uStack_684;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  LinearSpace3fa *local_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined4 local_450;
  undefined4 uStack_44c;
  undefined4 uStack_448;
  undefined4 uStack_444;
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  undefined4 local_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined1 local_3f0 [16];
  uint local_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  uint local_2a0;
  uint uStack_29c;
  uint uStack_298;
  uint uStack_294;
  undefined4 local_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  int local_220;
  int local_21c;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [32];
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar12 = prim[1];
  uVar93 = (ulong)(byte)PVar12;
  lVar22 = uVar93 * 0x25;
  auVar165 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar165 = vinsertps_avx(auVar165,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar164 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar164 = vinsertps_avx(auVar164,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar141 = *(float *)(prim + lVar22 + 0x12);
  auVar165 = vsubps_avx(auVar165,*(undefined1 (*) [16])(prim + lVar22 + 6));
  auVar101._0_4_ = fVar141 * auVar165._0_4_;
  auVar101._4_4_ = fVar141 * auVar165._4_4_;
  auVar101._8_4_ = fVar141 * auVar165._8_4_;
  auVar101._12_4_ = fVar141 * auVar165._12_4_;
  auVar142._0_4_ = fVar141 * auVar164._0_4_;
  auVar142._4_4_ = fVar141 * auVar164._4_4_;
  auVar142._8_4_ = fVar141 * auVar164._8_4_;
  auVar142._12_4_ = fVar141 * auVar164._12_4_;
  auVar165._8_8_ = 0;
  auVar165._0_8_ = *(ulong *)(prim + uVar93 * 4 + 6);
  auVar126 = vpmovsxbd_avx2(auVar165);
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar164._8_8_ = 0;
  auVar164._0_8_ = *(ulong *)(prim + uVar93 * 5 + 6);
  auVar127 = vpmovsxbd_avx2(auVar164);
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar93 * 6 + 6);
  auVar183 = vpmovsxbd_avx2(auVar5);
  auVar183 = vcvtdq2ps_avx(auVar183);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar93 * 0xf + 6);
  auVar158 = vpmovsxbd_avx2(auVar6);
  auVar158 = vcvtdq2ps_avx(auVar158);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar12 * 0x10 + 6);
  auVar110 = vpmovsxbd_avx2(auVar7);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar12 * 0x10 + uVar93 + 6);
  auVar133 = vpmovsxbd_avx2(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar93 * 0x1a + 6);
  auVar195 = vpmovsxbd_avx2(auVar9);
  auVar133 = vcvtdq2ps_avx(auVar133);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar93 * 0x1b + 6);
  auVar128 = vpmovsxbd_avx2(auVar10);
  auVar195 = vcvtdq2ps_avx(auVar195);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar93 * 0x1c + 6);
  auVar103 = vpmovsxbd_avx2(auVar11);
  auVar112 = vcvtdq2ps_avx(auVar128);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar215._4_4_ = auVar142._0_4_;
  auVar215._0_4_ = auVar142._0_4_;
  auVar215._8_4_ = auVar142._0_4_;
  auVar215._12_4_ = auVar142._0_4_;
  auVar215._16_4_ = auVar142._0_4_;
  auVar215._20_4_ = auVar142._0_4_;
  auVar215._24_4_ = auVar142._0_4_;
  auVar215._28_4_ = auVar142._0_4_;
  auVar165 = vmovshdup_avx(auVar142);
  uVar100 = auVar165._0_8_;
  auVar223._8_8_ = uVar100;
  auVar223._0_8_ = uVar100;
  auVar223._16_8_ = uVar100;
  auVar223._24_8_ = uVar100;
  auVar165 = vshufps_avx(auVar142,auVar142,0xaa);
  fVar141 = auVar165._0_4_;
  auVar213._0_4_ = fVar141 * auVar183._0_4_;
  fVar115 = auVar165._4_4_;
  auVar213._4_4_ = fVar115 * auVar183._4_4_;
  auVar213._8_4_ = fVar141 * auVar183._8_4_;
  auVar213._12_4_ = fVar115 * auVar183._12_4_;
  auVar213._16_4_ = fVar141 * auVar183._16_4_;
  auVar213._20_4_ = fVar115 * auVar183._20_4_;
  auVar213._28_36_ = in_ZMM10._28_36_;
  auVar213._24_4_ = fVar141 * auVar183._24_4_;
  auVar199._4_4_ = auVar133._4_4_ * fVar115;
  auVar199._0_4_ = auVar133._0_4_ * fVar141;
  auVar199._8_4_ = auVar133._8_4_ * fVar141;
  auVar199._12_4_ = auVar133._12_4_ * fVar115;
  auVar199._16_4_ = auVar133._16_4_ * fVar141;
  auVar199._20_4_ = auVar133._20_4_ * fVar115;
  auVar199._24_4_ = auVar133._24_4_ * fVar141;
  auVar199._28_4_ = auVar128._28_4_;
  auVar191._0_4_ = auVar103._0_4_ * fVar141;
  auVar191._4_4_ = auVar103._4_4_ * fVar115;
  auVar191._8_4_ = auVar103._8_4_ * fVar141;
  auVar191._12_4_ = auVar103._12_4_ * fVar115;
  auVar191._16_4_ = auVar103._16_4_ * fVar141;
  auVar191._20_4_ = auVar103._20_4_ * fVar115;
  auVar191._24_4_ = auVar103._24_4_ * fVar141;
  auVar191._28_4_ = 0;
  auVar165 = vfmadd231ps_fma(auVar213._0_32_,auVar223,auVar127);
  auVar164 = vfmadd231ps_fma(auVar199,auVar223,auVar110);
  auVar5 = vfmadd231ps_fma(auVar191,auVar112,auVar223);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar215,auVar126);
  auVar164 = vfmadd231ps_fma(ZEXT1632(auVar164),auVar215,auVar158);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar195,auVar215);
  auVar216._4_4_ = auVar101._0_4_;
  auVar216._0_4_ = auVar101._0_4_;
  auVar216._8_4_ = auVar101._0_4_;
  auVar216._12_4_ = auVar101._0_4_;
  auVar216._16_4_ = auVar101._0_4_;
  auVar216._20_4_ = auVar101._0_4_;
  auVar216._24_4_ = auVar101._0_4_;
  auVar216._28_4_ = auVar101._0_4_;
  auVar165 = vmovshdup_avx(auVar101);
  uVar100 = auVar165._0_8_;
  auVar224._8_8_ = uVar100;
  auVar224._0_8_ = uVar100;
  auVar224._16_8_ = uVar100;
  auVar224._24_8_ = uVar100;
  auVar165 = vshufps_avx(auVar101,auVar101,0xaa);
  fVar141 = auVar165._0_4_;
  auVar154._0_4_ = fVar141 * auVar183._0_4_;
  fVar115 = auVar165._4_4_;
  auVar154._4_4_ = fVar115 * auVar183._4_4_;
  auVar154._8_4_ = fVar141 * auVar183._8_4_;
  auVar154._12_4_ = fVar115 * auVar183._12_4_;
  auVar154._16_4_ = fVar141 * auVar183._16_4_;
  auVar154._20_4_ = fVar115 * auVar183._20_4_;
  auVar154._24_4_ = fVar141 * auVar183._24_4_;
  auVar154._28_4_ = 0;
  auVar128._4_4_ = auVar133._4_4_ * fVar115;
  auVar128._0_4_ = auVar133._0_4_ * fVar141;
  auVar128._8_4_ = auVar133._8_4_ * fVar141;
  auVar128._12_4_ = auVar133._12_4_ * fVar115;
  auVar128._16_4_ = auVar133._16_4_ * fVar141;
  auVar128._20_4_ = auVar133._20_4_ * fVar115;
  auVar128._24_4_ = auVar133._24_4_ * fVar141;
  auVar128._28_4_ = auVar183._28_4_;
  auVar183._4_4_ = auVar103._4_4_ * fVar115;
  auVar183._0_4_ = auVar103._0_4_ * fVar141;
  auVar183._8_4_ = auVar103._8_4_ * fVar141;
  auVar183._12_4_ = auVar103._12_4_ * fVar115;
  auVar183._16_4_ = auVar103._16_4_ * fVar141;
  auVar183._20_4_ = auVar103._20_4_ * fVar115;
  auVar183._24_4_ = auVar103._24_4_ * fVar141;
  auVar183._28_4_ = fVar115;
  auVar165 = vfmadd231ps_fma(auVar154,auVar224,auVar127);
  auVar7 = vfmadd231ps_fma(auVar128,auVar224,auVar110);
  auVar8 = vfmadd231ps_fma(auVar183,auVar224,auVar112);
  auVar101 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar216,auVar126);
  local_140._8_4_ = 0x7fffffff;
  local_140._0_8_ = 0x7fffffff7fffffff;
  local_140._12_4_ = 0x7fffffff;
  local_140._16_4_ = 0x7fffffff;
  local_140._20_4_ = 0x7fffffff;
  local_140._24_4_ = 0x7fffffff;
  local_140._28_4_ = 0x7fffffff;
  auVar166._8_4_ = 0x219392ef;
  auVar166._0_8_ = 0x219392ef219392ef;
  auVar166._12_4_ = 0x219392ef;
  auVar166._16_4_ = 0x219392ef;
  auVar166._20_4_ = 0x219392ef;
  auVar166._24_4_ = 0x219392ef;
  auVar166._28_4_ = 0x219392ef;
  auVar126 = vandps_avx(ZEXT1632(auVar6),local_140);
  auVar126 = vcmpps_avx(auVar126,auVar166,1);
  auVar127 = vblendvps_avx(ZEXT1632(auVar6),auVar166,auVar126);
  auVar126 = vandps_avx(ZEXT1632(auVar164),local_140);
  auVar126 = vcmpps_avx(auVar126,auVar166,1);
  auVar183 = vblendvps_avx(ZEXT1632(auVar164),auVar166,auVar126);
  auVar126 = vandps_avx(ZEXT1632(auVar5),local_140);
  auVar126 = vcmpps_avx(auVar126,auVar166,1);
  auVar126 = vblendvps_avx(ZEXT1632(auVar5),auVar166,auVar126);
  auVar142 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar216,auVar158);
  auVar158 = vrcpps_avx(auVar127);
  auVar102 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar216,auVar195);
  auVar192._8_4_ = 0x3f800000;
  auVar192._0_8_ = 0x3f8000003f800000;
  auVar192._12_4_ = 0x3f800000;
  auVar192._16_4_ = 0x3f800000;
  auVar192._20_4_ = 0x3f800000;
  auVar192._24_4_ = 0x3f800000;
  auVar192._28_4_ = 0x3f800000;
  auVar165 = vfnmadd213ps_fma(auVar127,auVar158,auVar192);
  auVar165 = vfmadd132ps_fma(ZEXT1632(auVar165),auVar158,auVar158);
  auVar127 = vrcpps_avx(auVar183);
  auVar164 = vfnmadd213ps_fma(auVar183,auVar127,auVar192);
  auVar183 = vrcpps_avx(auVar126);
  auVar164 = vfmadd132ps_fma(ZEXT1632(auVar164),auVar127,auVar127);
  auVar5 = vfnmadd213ps_fma(auVar126,auVar183,auVar192);
  auVar5 = vfmadd132ps_fma(ZEXT1632(auVar5),auVar183,auVar183);
  fVar141 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar22 + 0x16)) *
            *(float *)(prim + lVar22 + 0x1a);
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 * 7 + 6));
  auVar184._4_4_ = fVar141;
  auVar184._0_4_ = fVar141;
  auVar184._8_4_ = fVar141;
  auVar184._12_4_ = fVar141;
  auVar184._16_4_ = fVar141;
  auVar184._20_4_ = fVar141;
  auVar184._24_4_ = fVar141;
  auVar184._28_4_ = fVar141;
  auVar127 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 * 0xb + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar127 = vsubps_avx(auVar127,auVar126);
  auVar6 = vfmadd213ps_fma(auVar127,auVar184,auVar126);
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 * 9 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar127 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 * 0xd + 6));
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar127 = vsubps_avx(auVar127,auVar126);
  auVar7 = vfmadd213ps_fma(auVar127,auVar184,auVar126);
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 * 0x12 + 6));
  uVar96 = (ulong)(uint)((int)(uVar93 * 5) << 2);
  auVar127 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 * 2 + uVar96 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar127 = vsubps_avx(auVar127,auVar126);
  auVar8 = vfmadd213ps_fma(auVar127,auVar184,auVar126);
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar96 + 6));
  auVar127 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 * 0x18 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar127 = vsubps_avx(auVar127,auVar126);
  auVar9 = vfmadd213ps_fma(auVar127,auVar184,auVar126);
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 * 0x1d + 6));
  auVar127 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 + (ulong)(byte)PVar12 * 0x20 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar127 = vsubps_avx(auVar127,auVar126);
  auVar10 = vfmadd213ps_fma(auVar127,auVar184,auVar126);
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar12 * 0x20 - uVar93) + 6)
                           );
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar127 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 * 0x23 + 6));
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar127 = vsubps_avx(auVar127,auVar126);
  auVar11 = vfmadd213ps_fma(auVar127,auVar184,auVar126);
  auVar126 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar101));
  auVar158._4_4_ = auVar165._4_4_ * auVar126._4_4_;
  auVar158._0_4_ = auVar165._0_4_ * auVar126._0_4_;
  auVar158._8_4_ = auVar165._8_4_ * auVar126._8_4_;
  auVar158._12_4_ = auVar165._12_4_ * auVar126._12_4_;
  auVar158._16_4_ = auVar126._16_4_ * 0.0;
  auVar158._20_4_ = auVar126._20_4_ * 0.0;
  auVar158._24_4_ = auVar126._24_4_ * 0.0;
  auVar158._28_4_ = auVar126._28_4_;
  auVar126 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar101));
  auVar110._4_4_ = auVar165._4_4_ * auVar126._4_4_;
  auVar110._0_4_ = auVar165._0_4_ * auVar126._0_4_;
  auVar110._8_4_ = auVar165._8_4_ * auVar126._8_4_;
  auVar110._12_4_ = auVar165._12_4_ * auVar126._12_4_;
  auVar110._16_4_ = auVar126._16_4_ * 0.0;
  auVar110._20_4_ = auVar126._20_4_ * 0.0;
  auVar110._24_4_ = auVar126._24_4_ * 0.0;
  auVar110._28_4_ = auVar126._28_4_;
  auVar126 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar142));
  auVar133._4_4_ = auVar164._4_4_ * auVar126._4_4_;
  auVar133._0_4_ = auVar164._0_4_ * auVar126._0_4_;
  auVar133._8_4_ = auVar164._8_4_ * auVar126._8_4_;
  auVar133._12_4_ = auVar164._12_4_ * auVar126._12_4_;
  auVar133._16_4_ = auVar126._16_4_ * 0.0;
  auVar133._20_4_ = auVar126._20_4_ * 0.0;
  auVar133._24_4_ = auVar126._24_4_ * 0.0;
  auVar133._28_4_ = auVar126._28_4_;
  auVar126 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar142));
  auVar195._4_4_ = auVar164._4_4_ * auVar126._4_4_;
  auVar195._0_4_ = auVar164._0_4_ * auVar126._0_4_;
  auVar195._8_4_ = auVar164._8_4_ * auVar126._8_4_;
  auVar195._12_4_ = auVar164._12_4_ * auVar126._12_4_;
  auVar195._16_4_ = auVar126._16_4_ * 0.0;
  auVar195._20_4_ = auVar126._20_4_ * 0.0;
  auVar195._24_4_ = auVar126._24_4_ * 0.0;
  auVar195._28_4_ = auVar126._28_4_;
  auVar126 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar102));
  auVar112._4_4_ = auVar5._4_4_ * auVar126._4_4_;
  auVar112._0_4_ = auVar5._0_4_ * auVar126._0_4_;
  auVar112._8_4_ = auVar5._8_4_ * auVar126._8_4_;
  auVar112._12_4_ = auVar5._12_4_ * auVar126._12_4_;
  auVar112._16_4_ = auVar126._16_4_ * 0.0;
  auVar112._20_4_ = auVar126._20_4_ * 0.0;
  auVar112._24_4_ = auVar126._24_4_ * 0.0;
  auVar112._28_4_ = auVar126._28_4_;
  auVar126 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar102));
  auVar103._4_4_ = auVar5._4_4_ * auVar126._4_4_;
  auVar103._0_4_ = auVar5._0_4_ * auVar126._0_4_;
  auVar103._8_4_ = auVar5._8_4_ * auVar126._8_4_;
  auVar103._12_4_ = auVar5._12_4_ * auVar126._12_4_;
  auVar103._16_4_ = auVar126._16_4_ * 0.0;
  auVar103._20_4_ = auVar126._20_4_ * 0.0;
  auVar103._24_4_ = auVar126._24_4_ * 0.0;
  auVar103._28_4_ = auVar126._28_4_;
  auVar126 = vpminsd_avx2(auVar158,auVar110);
  auVar127 = vpminsd_avx2(auVar133,auVar195);
  auVar126 = vmaxps_avx(auVar126,auVar127);
  auVar127 = vpminsd_avx2(auVar112,auVar103);
  uVar99 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar193._4_4_ = uVar99;
  auVar193._0_4_ = uVar99;
  auVar193._8_4_ = uVar99;
  auVar193._12_4_ = uVar99;
  auVar193._16_4_ = uVar99;
  auVar193._20_4_ = uVar99;
  auVar193._24_4_ = uVar99;
  auVar193._28_4_ = uVar99;
  auVar127 = vmaxps_avx(auVar127,auVar193);
  auVar126 = vmaxps_avx(auVar126,auVar127);
  local_80._4_4_ = auVar126._4_4_ * 0.99999964;
  local_80._0_4_ = auVar126._0_4_ * 0.99999964;
  local_80._8_4_ = auVar126._8_4_ * 0.99999964;
  local_80._12_4_ = auVar126._12_4_ * 0.99999964;
  local_80._16_4_ = auVar126._16_4_ * 0.99999964;
  local_80._20_4_ = auVar126._20_4_ * 0.99999964;
  local_80._24_4_ = auVar126._24_4_ * 0.99999964;
  local_80._28_4_ = auVar126._28_4_;
  auVar126 = vpmaxsd_avx2(auVar158,auVar110);
  auVar127 = vpmaxsd_avx2(auVar133,auVar195);
  auVar126 = vminps_avx(auVar126,auVar127);
  auVar127 = vpmaxsd_avx2(auVar112,auVar103);
  uVar99 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar155._4_4_ = uVar99;
  auVar155._0_4_ = uVar99;
  auVar155._8_4_ = uVar99;
  auVar155._12_4_ = uVar99;
  auVar155._16_4_ = uVar99;
  auVar155._20_4_ = uVar99;
  auVar155._24_4_ = uVar99;
  auVar155._28_4_ = uVar99;
  auVar127 = vminps_avx(auVar127,auVar155);
  auVar126 = vminps_avx(auVar126,auVar127);
  auVar21._4_4_ = auVar126._4_4_ * 1.0000004;
  auVar21._0_4_ = auVar126._0_4_ * 1.0000004;
  auVar21._8_4_ = auVar126._8_4_ * 1.0000004;
  auVar21._12_4_ = auVar126._12_4_ * 1.0000004;
  auVar21._16_4_ = auVar126._16_4_ * 1.0000004;
  auVar21._20_4_ = auVar126._20_4_ * 1.0000004;
  auVar21._24_4_ = auVar126._24_4_ * 1.0000004;
  auVar21._28_4_ = auVar126._28_4_;
  auVar126._1_3_ = 0;
  auVar126[0] = PVar12;
  auVar126[4] = PVar12;
  auVar126._5_3_ = 0;
  auVar126[8] = PVar12;
  auVar126._9_3_ = 0;
  auVar126[0xc] = PVar12;
  auVar126._13_3_ = 0;
  auVar126[0x10] = PVar12;
  auVar126._17_3_ = 0;
  auVar126[0x14] = PVar12;
  auVar126._21_3_ = 0;
  auVar126[0x18] = PVar12;
  auVar126._25_3_ = 0;
  auVar126[0x1c] = PVar12;
  auVar126._29_3_ = 0;
  auVar127 = vpcmpgtd_avx2(auVar126,_DAT_01fe9900);
  auVar126 = vcmpps_avx(local_80,auVar21,2);
  auVar126 = vandps_avx(auVar126,auVar127);
  uVar91 = vmovmskps_avx(auVar126);
  if (uVar91 != 0) {
    uVar91 = uVar91 & 0xff;
    local_568 = pre->ray_space + k;
    local_560 = mm_lookupmask_ps._16_8_;
    uStack_558 = mm_lookupmask_ps._24_8_;
    uStack_550 = mm_lookupmask_ps._16_8_;
    uStack_548 = mm_lookupmask_ps._24_8_;
    local_708 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
    local_290 = 0x7fffffff;
    uStack_28c = 0x7fffffff;
    uStack_288 = 0x7fffffff;
    uStack_284 = 0x7fffffff;
    local_7d0 = prim;
    local_7c8 = pre;
    do {
      lVar22 = 0;
      for (uVar93 = (ulong)uVar91; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x8000000000000000) {
        lVar22 = lVar22 + 1;
      }
      uVar13 = *(uint *)(prim + 2);
      uVar14 = *(uint *)(prim + lVar22 * 4 + 6);
      pGVar98 = (context->scene->geometries).items[uVar13].ptr;
      uVar93 = (ulong)*(uint *)(*(long *)&pGVar98->field_0x58 +
                               (ulong)uVar14 *
                               pGVar98[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar141 = (pGVar98->time_range).lower;
      fVar141 = pGVar98->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar141) /
                ((pGVar98->time_range).upper - fVar141));
      auVar165 = vroundss_avx(ZEXT416((uint)fVar141),ZEXT416((uint)fVar141),9);
      auVar165 = vminss_avx(auVar165,ZEXT416((uint)(pGVar98->fnumTimeSegments + -1.0)));
      auVar165 = vmaxss_avx(ZEXT816(0) << 0x20,auVar165);
      fVar141 = fVar141 - auVar165._0_4_;
      fVar115 = 1.0 - fVar141;
      _Var17 = pGVar98[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar95 = (long)(int)auVar165._0_4_ * 0x38;
      lVar97 = *(long *)(_Var17 + 0x10 + lVar95);
      lVar18 = *(long *)(_Var17 + 0x38 + lVar95);
      lVar19 = *(long *)(_Var17 + 0x48 + lVar95);
      pfVar1 = (float *)(lVar18 + lVar19 * uVar93);
      auVar160._0_4_ = fVar141 * *pfVar1;
      auVar160._4_4_ = fVar141 * pfVar1[1];
      auVar160._8_4_ = fVar141 * pfVar1[2];
      auVar160._12_4_ = fVar141 * pfVar1[3];
      lVar22 = uVar93 + 1;
      pfVar1 = (float *)(lVar18 + lVar19 * lVar22);
      auVar143._0_4_ = fVar141 * *pfVar1;
      auVar143._4_4_ = fVar141 * pfVar1[1];
      auVar143._8_4_ = fVar141 * pfVar1[2];
      auVar143._12_4_ = fVar141 * pfVar1[3];
      p_Var20 = pGVar98[4].occlusionFilterN;
      auVar102._4_4_ = fVar115;
      auVar102._0_4_ = fVar115;
      auVar102._8_4_ = fVar115;
      auVar102._12_4_ = fVar115;
      auVar9 = vfmadd231ps_fma(auVar160,auVar102,
                               *(undefined1 (*) [16])(*(long *)(_Var17 + lVar95) + lVar97 * uVar93))
      ;
      auVar10 = vfmadd231ps_fma(auVar143,auVar102,
                                *(undefined1 (*) [16])(*(long *)(_Var17 + lVar95) + lVar97 * lVar22)
                               );
      pfVar1 = (float *)(*(long *)(p_Var20 + lVar95 + 0x38) +
                        uVar93 * *(long *)(p_Var20 + lVar95 + 0x48));
      auVar144._0_4_ = fVar141 * *pfVar1;
      auVar144._4_4_ = fVar141 * pfVar1[1];
      auVar144._8_4_ = fVar141 * pfVar1[2];
      auVar144._12_4_ = fVar141 * pfVar1[3];
      pfVar1 = (float *)(*(long *)(p_Var20 + lVar95 + 0x38) +
                        *(long *)(p_Var20 + lVar95 + 0x48) * lVar22);
      auVar122._0_4_ = fVar141 * *pfVar1;
      auVar122._4_4_ = fVar141 * pfVar1[1];
      auVar122._8_4_ = fVar141 * pfVar1[2];
      auVar122._12_4_ = fVar141 * pfVar1[3];
      auVar164 = vfmadd231ps_fma(auVar144,auVar102,
                                 *(undefined1 (*) [16])
                                  (*(long *)(p_Var20 + lVar95) +
                                  *(long *)(p_Var20 + lVar95 + 0x10) * uVar93));
      auVar5 = vfmadd231ps_fma(auVar122,auVar102,
                               *(undefined1 (*) [16])
                                (*(long *)(p_Var20 + lVar95) +
                                *(long *)(p_Var20 + lVar95 + 0x10) * lVar22));
      iVar15 = (int)pGVar98[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar22 = (long)iVar15 * 0x44;
      auVar165 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar6 = vinsertps_avx(auVar165,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar123._8_4_ = 0xbeaaaaab;
      auVar123._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar123._12_4_ = 0xbeaaaaab;
      auVar122 = vfnmadd213ps_fma(auVar164,auVar123,auVar9);
      auVar8 = vfmadd213ps_fma(auVar5,auVar123,auVar10);
      auVar164 = vsubps_avx(auVar9,auVar6);
      uVar99 = auVar164._0_4_;
      auVar145._4_4_ = uVar99;
      auVar145._0_4_ = uVar99;
      auVar145._8_4_ = uVar99;
      auVar145._12_4_ = uVar99;
      auVar165 = vshufps_avx(auVar164,auVar164,0x55);
      auVar164 = vshufps_avx(auVar164,auVar164,0xaa);
      aVar3 = (local_568->vx).field_0;
      aVar4 = (local_568->vy).field_0;
      fVar141 = (local_568->vz).field_0.m128[0];
      fVar115 = *(float *)((long)&(local_568->vz).field_0 + 4);
      fVar197 = *(float *)((long)&(local_568->vz).field_0 + 8);
      fVar203 = *(float *)((long)&(local_568->vz).field_0 + 0xc);
      auVar198._0_4_ = fVar141 * auVar164._0_4_;
      auVar198._4_4_ = fVar115 * auVar164._4_4_;
      auVar198._8_4_ = fVar197 * auVar164._8_4_;
      auVar198._12_4_ = fVar203 * auVar164._12_4_;
      auVar165 = vfmadd231ps_fma(auVar198,(undefined1  [16])aVar4,auVar165);
      auVar11 = vfmadd231ps_fma(auVar165,(undefined1  [16])aVar3,auVar145);
      auVar165 = vblendps_avx(auVar11,auVar9,8);
      auVar5 = vsubps_avx(auVar122,auVar6);
      uVar99 = auVar5._0_4_;
      auVar161._4_4_ = uVar99;
      auVar161._0_4_ = uVar99;
      auVar161._8_4_ = uVar99;
      auVar161._12_4_ = uVar99;
      auVar164 = vshufps_avx(auVar5,auVar5,0x55);
      auVar5 = vshufps_avx(auVar5,auVar5,0xaa);
      auVar205._0_4_ = fVar141 * auVar5._0_4_;
      auVar205._4_4_ = fVar115 * auVar5._4_4_;
      auVar205._8_4_ = fVar197 * auVar5._8_4_;
      auVar205._12_4_ = fVar203 * auVar5._12_4_;
      auVar164 = vfmadd231ps_fma(auVar205,(undefined1  [16])aVar4,auVar164);
      auVar101 = vfmadd231ps_fma(auVar164,(undefined1  [16])aVar3,auVar161);
      auVar164 = vblendps_avx(auVar101,auVar122,8);
      auVar7 = vsubps_avx(auVar8,auVar6);
      uVar99 = auVar7._0_4_;
      auVar189._4_4_ = uVar99;
      auVar189._0_4_ = uVar99;
      auVar189._8_4_ = uVar99;
      auVar189._12_4_ = uVar99;
      auVar5 = vshufps_avx(auVar7,auVar7,0x55);
      auVar7 = vshufps_avx(auVar7,auVar7,0xaa);
      auVar207._0_4_ = fVar141 * auVar7._0_4_;
      auVar207._4_4_ = fVar115 * auVar7._4_4_;
      auVar207._8_4_ = fVar197 * auVar7._8_4_;
      auVar207._12_4_ = fVar203 * auVar7._12_4_;
      auVar5 = vfmadd231ps_fma(auVar207,(undefined1  [16])aVar4,auVar5);
      auVar142 = vfmadd231ps_fma(auVar5,(undefined1  [16])aVar3,auVar189);
      auVar5 = vblendps_avx(auVar142,auVar8,8);
      auVar7 = vsubps_avx(auVar10,auVar6);
      uVar99 = auVar7._0_4_;
      auVar190._4_4_ = uVar99;
      auVar190._0_4_ = uVar99;
      auVar190._8_4_ = uVar99;
      auVar190._12_4_ = uVar99;
      auVar6 = vshufps_avx(auVar7,auVar7,0x55);
      auVar7 = vshufps_avx(auVar7,auVar7,0xaa);
      auVar211._0_4_ = fVar141 * auVar7._0_4_;
      auVar211._4_4_ = fVar115 * auVar7._4_4_;
      auVar211._8_4_ = fVar197 * auVar7._8_4_;
      auVar211._12_4_ = fVar203 * auVar7._12_4_;
      auVar6 = vfmadd231ps_fma(auVar211,(undefined1  [16])aVar4,auVar6);
      auVar102 = vfmadd231ps_fma(auVar6,(undefined1  [16])aVar3,auVar190);
      auVar6 = vblendps_avx(auVar102,auVar10,8);
      auVar23._4_4_ = uStack_28c;
      auVar23._0_4_ = local_290;
      auVar23._8_4_ = uStack_288;
      auVar23._12_4_ = uStack_284;
      auVar165 = vandps_avx(auVar165,auVar23);
      auVar164 = vandps_avx(auVar164,auVar23);
      auVar7 = vmaxps_avx(auVar165,auVar164);
      auVar165 = vandps_avx(auVar5,auVar23);
      auVar164 = vandps_avx(auVar6,auVar23);
      auVar165 = vmaxps_avx(auVar165,auVar164);
      auVar165 = vmaxps_avx(auVar7,auVar165);
      auVar164 = vmovshdup_avx(auVar165);
      auVar164 = vmaxss_avx(auVar164,auVar165);
      auVar165 = vshufpd_avx(auVar165,auVar165,1);
      auVar165 = vmaxss_avx(auVar165,auVar164);
      auVar164 = vmovshdup_avx(auVar11);
      uVar100 = auVar164._0_8_;
      local_500._8_8_ = uVar100;
      local_500._0_8_ = uVar100;
      local_500._16_8_ = uVar100;
      local_500._24_8_ = uVar100;
      auVar164 = vmovshdup_avx(auVar101);
      uVar100 = auVar164._0_8_;
      local_4e0._8_8_ = uVar100;
      local_4e0._0_8_ = uVar100;
      local_4e0._16_8_ = uVar100;
      local_4e0._24_8_ = uVar100;
      auVar126 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x908);
      uVar99 = auVar142._0_4_;
      local_700._4_4_ = uVar99;
      local_700._0_4_ = uVar99;
      local_700._8_4_ = uVar99;
      local_700._12_4_ = uVar99;
      local_700._16_4_ = uVar99;
      local_700._20_4_ = uVar99;
      local_700._24_4_ = uVar99;
      local_700._28_4_ = uVar99;
      auVar164 = vmovshdup_avx(auVar142);
      uVar100 = auVar164._0_8_;
      local_5c0._8_8_ = uVar100;
      local_5c0._0_8_ = uVar100;
      local_5c0._16_8_ = uVar100;
      local_5c0._24_8_ = uVar100;
      fVar141 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar22 + 0xd8c);
      auVar90 = *(undefined1 (*) [28])(bezier_basis0 + lVar22 + 0xd8c);
      auVar164 = vmovshdup_avx(auVar102);
      local_480 = auVar164._0_8_;
      local_4a0 = auVar102._0_4_;
      auVar127._0_4_ = local_4a0 * fVar141;
      auVar127._4_4_ = local_4a0 * *(float *)(bezier_basis0 + lVar22 + 0xd90);
      auVar127._8_4_ = local_4a0 * *(float *)(bezier_basis0 + lVar22 + 0xd94);
      auVar127._12_4_ = local_4a0 * *(float *)(bezier_basis0 + lVar22 + 0xd98);
      auVar127._16_4_ = local_4a0 * *(float *)(bezier_basis0 + lVar22 + 0xd9c);
      auVar127._20_4_ = local_4a0 * *(float *)(bezier_basis0 + lVar22 + 0xda0);
      auVar127._24_4_ = local_4a0 * *(float *)(bezier_basis0 + lVar22 + 0xda4);
      auVar127._28_4_ = 0;
      auVar5 = vfmadd231ps_fma(auVar127,auVar126,local_700);
      fVar140 = auVar164._0_4_;
      auVar178._0_4_ = fVar140 * fVar141;
      fVar116 = auVar164._4_4_;
      auVar178._4_4_ = fVar116 * *(float *)(bezier_basis0 + lVar22 + 0xd90);
      auVar178._8_4_ = fVar140 * *(float *)(bezier_basis0 + lVar22 + 0xd94);
      auVar178._12_4_ = fVar116 * *(float *)(bezier_basis0 + lVar22 + 0xd98);
      auVar178._16_4_ = fVar140 * *(float *)(bezier_basis0 + lVar22 + 0xd9c);
      auVar178._20_4_ = fVar116 * *(float *)(bezier_basis0 + lVar22 + 0xda0);
      auVar178._24_4_ = fVar140 * *(float *)(bezier_basis0 + lVar22 + 0xda4);
      auVar178._28_4_ = 0;
      auVar164 = vfmadd231ps_fma(auVar178,auVar126,local_5c0);
      auVar127 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x484);
      uVar99 = auVar101._0_4_;
      local_6c0._4_4_ = uVar99;
      local_6c0._0_4_ = uVar99;
      local_6c0._8_4_ = uVar99;
      local_6c0._12_4_ = uVar99;
      local_6c0._16_4_ = uVar99;
      local_6c0._20_4_ = uVar99;
      local_6c0._24_4_ = uVar99;
      local_6c0._28_4_ = uVar99;
      auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar127,local_6c0);
      auVar164 = vfmadd231ps_fma(ZEXT1632(auVar164),auVar127,local_4e0);
      auVar183 = *(undefined1 (*) [32])(bezier_basis0 + lVar22);
      uVar99 = auVar11._0_4_;
      local_7c0._4_4_ = uVar99;
      local_7c0._0_4_ = uVar99;
      local_7c0._8_4_ = uVar99;
      local_7c0._12_4_ = uVar99;
      local_7c0._16_4_ = uVar99;
      local_7c0._20_4_ = uVar99;
      local_7c0._24_4_ = uVar99;
      local_7c0._28_4_ = uVar99;
      auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar183,local_7c0);
      auVar164 = vfmadd231ps_fma(ZEXT1632(auVar164),auVar183,local_500);
      local_340 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x908);
      local_360 = *(float *)(bezier_basis1 + lVar22 + 0xd8c);
      fStack_35c = *(float *)(bezier_basis1 + lVar22 + 0xd90);
      fStack_358 = *(float *)(bezier_basis1 + lVar22 + 0xd94);
      fStack_354 = *(float *)(bezier_basis1 + lVar22 + 0xd98);
      fStack_350 = *(float *)(bezier_basis1 + lVar22 + 0xd9c);
      fStack_34c = *(float *)(bezier_basis1 + lVar22 + 0xda0);
      fStack_348 = *(float *)(bezier_basis1 + lVar22 + 0xda4);
      auVar24._4_4_ = local_4a0 * fStack_35c;
      auVar24._0_4_ = local_4a0 * local_360;
      auVar24._8_4_ = local_4a0 * fStack_358;
      auVar24._12_4_ = local_4a0 * fStack_354;
      auVar24._16_4_ = local_4a0 * fStack_350;
      auVar24._20_4_ = local_4a0 * fStack_34c;
      auVar24._24_4_ = local_4a0 * fStack_348;
      auVar24._28_4_ = local_4a0;
      auVar6 = vfmadd231ps_fma(auVar24,local_340,local_700);
      auVar25._4_4_ = fVar116 * fStack_35c;
      auVar25._0_4_ = fVar140 * local_360;
      auVar25._8_4_ = fVar140 * fStack_358;
      auVar25._12_4_ = fVar116 * fStack_354;
      auVar25._16_4_ = fVar140 * fStack_350;
      auVar25._20_4_ = fVar116 * fStack_34c;
      auVar25._24_4_ = fVar140 * fStack_348;
      auVar25._28_4_ = fVar116;
      auVar7 = vfmadd231ps_fma(auVar25,local_340,local_5c0);
      auVar158 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x484);
      auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar158,local_6c0);
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar158,local_4e0);
      auVar110 = *(undefined1 (*) [32])(bezier_basis1 + lVar22);
      auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar110,local_7c0);
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar110,local_500);
      auVar103 = ZEXT1632(auVar6);
      auVar128 = ZEXT1632(auVar5);
      local_300 = vsubps_avx(auVar103,auVar128);
      local_2c0 = ZEXT1632(auVar7);
      local_2e0 = ZEXT1632(auVar164);
      local_320 = vsubps_avx(local_2c0,local_2e0);
      auVar104._0_4_ = local_300._0_4_ * auVar164._0_4_;
      auVar104._4_4_ = local_300._4_4_ * auVar164._4_4_;
      auVar104._8_4_ = local_300._8_4_ * auVar164._8_4_;
      auVar104._12_4_ = local_300._12_4_ * auVar164._12_4_;
      auVar104._16_4_ = local_300._16_4_ * 0.0;
      auVar104._20_4_ = local_300._20_4_ * 0.0;
      auVar104._24_4_ = local_300._24_4_ * 0.0;
      auVar104._28_4_ = 0;
      fVar197 = local_320._0_4_;
      auVar129._0_4_ = fVar197 * auVar5._0_4_;
      fVar203 = local_320._4_4_;
      auVar129._4_4_ = fVar203 * auVar5._4_4_;
      fVar204 = local_320._8_4_;
      auVar129._8_4_ = fVar204 * auVar5._8_4_;
      fVar117 = local_320._12_4_;
      auVar129._12_4_ = fVar117 * auVar5._12_4_;
      fVar118 = local_320._16_4_;
      auVar129._16_4_ = fVar118 * 0.0;
      fVar119 = local_320._20_4_;
      auVar129._20_4_ = fVar119 * 0.0;
      fVar120 = local_320._24_4_;
      auVar129._24_4_ = fVar120 * 0.0;
      auVar129._28_4_ = 0;
      auVar195 = vsubps_avx(auVar104,auVar129);
      auVar164 = vpermilps_avx(auVar9,0xff);
      uVar100 = auVar164._0_8_;
      local_a0._8_8_ = uVar100;
      local_a0._0_8_ = uVar100;
      local_a0._16_8_ = uVar100;
      local_a0._24_8_ = uVar100;
      auVar5 = vpermilps_avx(auVar122,0xff);
      uVar100 = auVar5._0_8_;
      auVar220._8_8_ = uVar100;
      auVar220._0_8_ = uVar100;
      auVar220._16_8_ = uVar100;
      auVar220._24_8_ = uVar100;
      auVar5 = vpermilps_avx(auVar8,0xff);
      uVar100 = auVar5._0_8_;
      auVar167._8_8_ = uVar100;
      auVar167._0_8_ = uVar100;
      auVar167._16_8_ = uVar100;
      auVar167._24_8_ = uVar100;
      auVar5 = vpermilps_avx(auVar10,0xff);
      local_c0 = auVar5._0_8_;
      local_860 = auVar90._0_4_;
      fStack_85c = auVar90._4_4_;
      fStack_858 = auVar90._8_4_;
      fStack_854 = auVar90._12_4_;
      fStack_850 = auVar90._16_4_;
      fStack_84c = auVar90._20_4_;
      fStack_848 = auVar90._24_4_;
      fVar141 = auVar5._0_4_;
      fVar115 = auVar5._4_4_;
      auVar26._4_4_ = fVar115 * fStack_85c;
      auVar26._0_4_ = fVar141 * local_860;
      auVar26._8_4_ = fVar141 * fStack_858;
      auVar26._12_4_ = fVar115 * fStack_854;
      auVar26._16_4_ = fVar141 * fStack_850;
      auVar26._20_4_ = fVar115 * fStack_84c;
      auVar26._24_4_ = fVar141 * fStack_848;
      auVar26._28_4_ = uVar99;
      auVar5 = vfmadd231ps_fma(auVar26,auVar126,auVar167);
      auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar127,auVar220);
      auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar183,local_a0);
      uStack_b8 = local_c0;
      uStack_b0 = local_c0;
      uStack_a8 = local_c0;
      fStack_344 = (float)*(undefined4 *)(bezier_basis1 + lVar22 + 0xda8);
      auVar27._4_4_ = fVar115 * fStack_35c;
      auVar27._0_4_ = fVar141 * local_360;
      auVar27._8_4_ = fVar141 * fStack_358;
      auVar27._12_4_ = fVar115 * fStack_354;
      auVar27._16_4_ = fVar141 * fStack_350;
      auVar27._20_4_ = fVar115 * fStack_34c;
      auVar27._24_4_ = fVar141 * fStack_348;
      auVar27._28_4_ = auVar183._28_4_;
      auVar6 = vfmadd231ps_fma(auVar27,local_340,auVar167);
      auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar158,auVar220);
      auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar110,local_a0);
      auVar28._4_4_ = fVar203 * fVar203;
      auVar28._0_4_ = fVar197 * fVar197;
      auVar28._8_4_ = fVar204 * fVar204;
      auVar28._12_4_ = fVar117 * fVar117;
      auVar28._16_4_ = fVar118 * fVar118;
      auVar28._20_4_ = fVar119 * fVar119;
      auVar28._24_4_ = fVar120 * fVar120;
      auVar28._28_4_ = auVar164._4_4_;
      auVar164 = vfmadd231ps_fma(auVar28,local_300,local_300);
      auVar133 = vmaxps_avx(ZEXT1632(auVar5),ZEXT1632(auVar6));
      auVar29._4_4_ = auVar133._4_4_ * auVar133._4_4_ * auVar164._4_4_;
      auVar29._0_4_ = auVar133._0_4_ * auVar133._0_4_ * auVar164._0_4_;
      auVar29._8_4_ = auVar133._8_4_ * auVar133._8_4_ * auVar164._8_4_;
      auVar29._12_4_ = auVar133._12_4_ * auVar133._12_4_ * auVar164._12_4_;
      auVar29._16_4_ = auVar133._16_4_ * auVar133._16_4_ * 0.0;
      auVar29._20_4_ = auVar133._20_4_ * auVar133._20_4_ * 0.0;
      auVar29._24_4_ = auVar133._24_4_ * auVar133._24_4_ * 0.0;
      auVar29._28_4_ = auVar133._28_4_;
      auVar30._4_4_ = auVar195._4_4_ * auVar195._4_4_;
      auVar30._0_4_ = auVar195._0_4_ * auVar195._0_4_;
      auVar30._8_4_ = auVar195._8_4_ * auVar195._8_4_;
      auVar30._12_4_ = auVar195._12_4_ * auVar195._12_4_;
      auVar30._16_4_ = auVar195._16_4_ * auVar195._16_4_;
      auVar30._20_4_ = auVar195._20_4_ * auVar195._20_4_;
      auVar30._24_4_ = auVar195._24_4_ * auVar195._24_4_;
      auVar30._28_4_ = auVar195._28_4_;
      auVar133 = vcmpps_avx(auVar30,auVar29,2);
      fVar141 = auVar165._0_4_ * 4.7683716e-07;
      auVar105._0_4_ = (float)iVar15;
      register0x00001504 = auVar102._4_12_;
      auVar105._4_4_ = auVar105._0_4_;
      auVar105._8_4_ = auVar105._0_4_;
      auVar105._12_4_ = auVar105._0_4_;
      auVar105._16_4_ = auVar105._0_4_;
      auVar105._20_4_ = auVar105._0_4_;
      auVar105._24_4_ = auVar105._0_4_;
      auVar105._28_4_ = auVar105._0_4_;
      auVar195 = vcmpps_avx(_DAT_01faff40,auVar105,1);
      auVar165 = vpermilps_avx(auVar11,0xaa);
      uVar100 = auVar165._0_8_;
      local_5e0._8_8_ = uVar100;
      local_5e0._0_8_ = uVar100;
      local_5e0._16_8_ = uVar100;
      local_5e0._24_8_ = uVar100;
      auVar165 = vpermilps_avx(auVar101,0xaa);
      uVar100 = auVar165._0_8_;
      auVar217._8_8_ = uVar100;
      auVar217._0_8_ = uVar100;
      auVar217._16_8_ = uVar100;
      auVar217._24_8_ = uVar100;
      auVar164 = vpermilps_avx(auVar142,0xaa);
      uVar100 = auVar164._0_8_;
      local_4c0._8_8_ = uVar100;
      local_4c0._0_8_ = uVar100;
      local_4c0._16_8_ = uVar100;
      local_4c0._24_8_ = uVar100;
      auVar165 = vshufps_avx(auVar102,auVar102,0xaa);
      uVar100 = auVar165._0_8_;
      register0x00001508 = uVar100;
      local_680 = uVar100;
      register0x00001510 = uVar100;
      register0x00001518 = uVar100;
      auVar213 = ZEXT3264(_local_680);
      auVar112 = auVar195 & auVar133;
      uVar94 = *(uint *)(ray + k * 4 + 0x30);
      local_740._0_16_ = ZEXT416(uVar94);
      local_7f0 = auVar9._0_8_;
      uStack_7e8 = auVar9._8_8_;
      local_810 = auVar122._0_8_;
      uStack_808 = auVar122._8_8_;
      local_820 = auVar8._0_8_;
      uStack_818 = auVar8._8_8_;
      local_800._0_4_ = auVar10._0_4_;
      fVar115 = (float)local_800;
      local_800._4_4_ = auVar10._4_4_;
      fVar197 = local_800._4_4_;
      uStack_7f8._0_4_ = auVar10._8_4_;
      fVar203 = (float)uStack_7f8;
      uStack_7f8._4_4_ = auVar10._12_4_;
      fVar204 = uStack_7f8._4_4_;
      local_800 = auVar10._0_8_;
      uStack_7f8 = auVar10._8_8_;
      fStack_49c = local_4a0;
      fStack_498 = local_4a0;
      fStack_494 = local_4a0;
      fStack_490 = local_4a0;
      fStack_48c = local_4a0;
      fStack_488 = local_4a0;
      fStack_484 = local_4a0;
      uStack_478 = local_480;
      uStack_470 = local_480;
      uStack_468 = local_480;
      local_690._0_4_ = auVar105._0_4_;
      if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar112 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar112 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar112 >> 0x7f,0) == '\0') &&
            (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar112 >> 0xbf,0) == '\0') &&
          (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar112[0x1f]) {
        auVar202 = ZEXT3264(local_6c0);
        auVar209 = ZEXT3264(local_7c0);
      }
      else {
        local_380 = vandps_avx(auVar133,auVar195);
        fVar210 = auVar165._0_4_;
        fVar214 = auVar165._4_4_;
        auVar31._4_4_ = fVar214 * fStack_35c;
        auVar31._0_4_ = fVar210 * local_360;
        auVar31._8_4_ = fVar210 * fStack_358;
        auVar31._12_4_ = fVar214 * fStack_354;
        auVar31._16_4_ = fVar210 * fStack_350;
        auVar31._20_4_ = fVar214 * fStack_34c;
        auVar31._24_4_ = fVar210 * fStack_348;
        auVar31._28_4_ = local_380._28_4_;
        auVar165 = vfmadd213ps_fma(local_340,local_4c0,auVar31);
        auVar165 = vfmadd213ps_fma(auVar158,auVar217,ZEXT1632(auVar165));
        auVar165 = vfmadd213ps_fma(auVar110,local_5e0,ZEXT1632(auVar165));
        auVar106._0_4_ = fVar210 * local_860;
        auVar106._4_4_ = fVar214 * fStack_85c;
        auVar106._8_4_ = fVar210 * fStack_858;
        auVar106._12_4_ = fVar214 * fStack_854;
        auVar106._16_4_ = fVar210 * fStack_850;
        auVar106._20_4_ = fVar214 * fStack_84c;
        auVar106._24_4_ = fVar210 * fStack_848;
        auVar106._28_4_ = 0;
        auVar7 = vfmadd213ps_fma(auVar126,local_4c0,auVar106);
        auVar7 = vfmadd213ps_fma(auVar127,auVar217,ZEXT1632(auVar7));
        auVar126 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x1210);
        auVar127 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x1694);
        auVar158 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x1b18);
        fVar117 = *(float *)(bezier_basis0 + lVar22 + 0x1f9c);
        fVar118 = *(float *)(bezier_basis0 + lVar22 + 0x1fa0);
        fVar119 = *(float *)(bezier_basis0 + lVar22 + 0x1fa4);
        fVar120 = *(float *)(bezier_basis0 + lVar22 + 0x1fa8);
        fVar121 = *(float *)(bezier_basis0 + lVar22 + 0x1fac);
        fVar85 = *(float *)(bezier_basis0 + lVar22 + 0x1fb0);
        fVar86 = *(float *)(bezier_basis0 + lVar22 + 0x1fb4);
        auVar179._0_4_ = fVar117 * local_4a0;
        auVar179._4_4_ = fVar118 * local_4a0;
        auVar179._8_4_ = fVar119 * local_4a0;
        auVar179._12_4_ = fVar120 * local_4a0;
        auVar179._16_4_ = fVar121 * local_4a0;
        auVar179._20_4_ = fVar85 * local_4a0;
        auVar179._24_4_ = fVar86 * local_4a0;
        auVar179._28_4_ = 0;
        auVar194._0_4_ = fVar140 * fVar117;
        auVar194._4_4_ = fVar116 * fVar118;
        auVar194._8_4_ = fVar140 * fVar119;
        auVar194._12_4_ = fVar116 * fVar120;
        auVar194._16_4_ = fVar140 * fVar121;
        auVar194._20_4_ = fVar116 * fVar85;
        auVar194._24_4_ = fVar140 * fVar86;
        auVar194._28_4_ = 0;
        auVar32._4_4_ = fVar118 * fVar214;
        auVar32._0_4_ = fVar117 * fVar210;
        auVar32._8_4_ = fVar119 * fVar210;
        auVar32._12_4_ = fVar120 * fVar214;
        auVar32._16_4_ = fVar121 * fVar210;
        auVar32._20_4_ = fVar85 * fVar214;
        auVar32._24_4_ = fVar86 * fVar210;
        auVar32._28_4_ = local_340._28_4_;
        auVar10 = vfmadd231ps_fma(auVar179,auVar158,local_700);
        auVar11 = vfmadd231ps_fma(auVar194,auVar158,local_5c0);
        auVar101 = vfmadd231ps_fma(auVar32,local_4c0,auVar158);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar127,local_6c0);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar127,local_4e0);
        auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar127,auVar217);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar126,local_7c0);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar126,local_500);
        auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar126,local_5e0);
        fVar117 = *(float *)(bezier_basis1 + lVar22 + 0x1f9c);
        fVar118 = *(float *)(bezier_basis1 + lVar22 + 0x1fa0);
        fVar119 = *(float *)(bezier_basis1 + lVar22 + 0x1fa4);
        fVar120 = *(float *)(bezier_basis1 + lVar22 + 0x1fa8);
        fVar121 = *(float *)(bezier_basis1 + lVar22 + 0x1fac);
        fVar85 = *(float *)(bezier_basis1 + lVar22 + 0x1fb0);
        fVar86 = *(float *)(bezier_basis1 + lVar22 + 0x1fb4);
        auVar33._4_4_ = local_4a0 * fVar118;
        auVar33._0_4_ = local_4a0 * fVar117;
        auVar33._8_4_ = local_4a0 * fVar119;
        auVar33._12_4_ = local_4a0 * fVar120;
        auVar33._16_4_ = local_4a0 * fVar121;
        auVar33._20_4_ = local_4a0 * fVar85;
        auVar33._24_4_ = local_4a0 * fVar86;
        auVar33._28_4_ = auVar164._4_4_;
        auVar34._4_4_ = fVar116 * fVar118;
        auVar34._0_4_ = fVar140 * fVar117;
        auVar34._8_4_ = fVar140 * fVar119;
        auVar34._12_4_ = fVar116 * fVar120;
        auVar34._16_4_ = fVar140 * fVar121;
        auVar34._20_4_ = fVar116 * fVar85;
        auVar34._24_4_ = fVar140 * fVar86;
        auVar34._28_4_ = fVar116;
        auVar35._4_4_ = fVar214 * fVar118;
        auVar35._0_4_ = fVar210 * fVar117;
        auVar35._8_4_ = fVar210 * fVar119;
        auVar35._12_4_ = fVar214 * fVar120;
        auVar35._16_4_ = fVar210 * fVar121;
        auVar35._20_4_ = fVar214 * fVar85;
        auVar35._24_4_ = fVar210 * fVar86;
        auVar35._28_4_ = fVar214;
        auVar126 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x1b18);
        auVar164 = vfmadd231ps_fma(auVar33,auVar126,local_700);
        auVar142 = vfmadd231ps_fma(auVar34,auVar126,local_5c0);
        auVar102 = vfmadd231ps_fma(auVar35,local_4c0,auVar126);
        auVar126 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x1694);
        auVar164 = vfmadd231ps_fma(ZEXT1632(auVar164),auVar126,local_6c0);
        auVar142 = vfmadd231ps_fma(ZEXT1632(auVar142),auVar126,local_4e0);
        auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar126,auVar217);
        auVar126 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x1210);
        auVar164 = vfmadd231ps_fma(ZEXT1632(auVar164),auVar126,local_7c0);
        auVar142 = vfmadd231ps_fma(ZEXT1632(auVar142),auVar126,local_500);
        auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),local_5e0,auVar126);
        auVar126 = vandps_avx(local_140,ZEXT1632(auVar10));
        auVar127 = vandps_avx(ZEXT1632(auVar11),local_140);
        auVar127 = vmaxps_avx(auVar126,auVar127);
        auVar126 = vandps_avx(ZEXT1632(auVar101),local_140);
        auVar126 = vmaxps_avx(auVar127,auVar126);
        auVar130._4_4_ = fVar141;
        auVar130._0_4_ = fVar141;
        auVar130._8_4_ = fVar141;
        auVar130._12_4_ = fVar141;
        auVar130._16_4_ = fVar141;
        auVar130._20_4_ = fVar141;
        auVar130._24_4_ = fVar141;
        auVar130._28_4_ = fVar141;
        auVar126 = vcmpps_avx(auVar126,auVar130,1);
        auVar158 = vblendvps_avx(ZEXT1632(auVar10),local_300,auVar126);
        auVar110 = vblendvps_avx(ZEXT1632(auVar11),local_320,auVar126);
        auVar126 = vandps_avx(ZEXT1632(auVar164),local_140);
        auVar127 = vandps_avx(ZEXT1632(auVar142),local_140);
        auVar127 = vmaxps_avx(auVar126,auVar127);
        auVar126 = vandps_avx(ZEXT1632(auVar102),local_140);
        auVar126 = vmaxps_avx(auVar127,auVar126);
        auVar127 = vcmpps_avx(auVar126,auVar130,1);
        auVar126 = vblendvps_avx(ZEXT1632(auVar164),local_300,auVar127);
        auVar127 = vblendvps_avx(ZEXT1632(auVar142),local_320,auVar127);
        auVar164 = vfmadd213ps_fma(auVar183,local_5e0,ZEXT1632(auVar7));
        auVar7 = vfmadd213ps_fma(auVar158,auVar158,ZEXT832(0) << 0x20);
        auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar110,auVar110);
        auVar183 = vrsqrtps_avx(ZEXT1632(auVar7));
        fVar140 = auVar183._0_4_;
        fVar116 = auVar183._4_4_;
        fVar117 = auVar183._8_4_;
        fVar118 = auVar183._12_4_;
        fVar119 = auVar183._16_4_;
        fVar120 = auVar183._20_4_;
        fVar121 = auVar183._24_4_;
        auVar36._4_4_ = fVar116 * fVar116 * fVar116 * auVar7._4_4_ * -0.5;
        auVar36._0_4_ = fVar140 * fVar140 * fVar140 * auVar7._0_4_ * -0.5;
        auVar36._8_4_ = fVar117 * fVar117 * fVar117 * auVar7._8_4_ * -0.5;
        auVar36._12_4_ = fVar118 * fVar118 * fVar118 * auVar7._12_4_ * -0.5;
        auVar36._16_4_ = fVar119 * fVar119 * fVar119 * -0.0;
        auVar36._20_4_ = fVar120 * fVar120 * fVar120 * -0.0;
        auVar36._24_4_ = fVar121 * fVar121 * fVar121 * -0.0;
        auVar36._28_4_ = 0;
        auVar218._8_4_ = 0x3fc00000;
        auVar218._0_8_ = 0x3fc000003fc00000;
        auVar218._12_4_ = 0x3fc00000;
        auVar218._16_4_ = 0x3fc00000;
        auVar218._20_4_ = 0x3fc00000;
        auVar218._24_4_ = 0x3fc00000;
        auVar218._28_4_ = 0x3fc00000;
        auVar7 = vfmadd231ps_fma(auVar36,auVar218,auVar183);
        fVar140 = auVar7._0_4_;
        fVar116 = auVar7._4_4_;
        auVar37._4_4_ = auVar110._4_4_ * fVar116;
        auVar37._0_4_ = auVar110._0_4_ * fVar140;
        fVar117 = auVar7._8_4_;
        auVar37._8_4_ = auVar110._8_4_ * fVar117;
        fVar118 = auVar7._12_4_;
        auVar37._12_4_ = auVar110._12_4_ * fVar118;
        auVar37._16_4_ = auVar110._16_4_ * 0.0;
        auVar37._20_4_ = auVar110._20_4_ * 0.0;
        auVar37._24_4_ = auVar110._24_4_ * 0.0;
        auVar37._28_4_ = auVar183._28_4_;
        auVar38._4_4_ = -auVar158._4_4_ * fVar116;
        auVar38._0_4_ = -auVar158._0_4_ * fVar140;
        auVar38._8_4_ = -auVar158._8_4_ * fVar117;
        auVar38._12_4_ = -auVar158._12_4_ * fVar118;
        auVar38._16_4_ = -auVar158._16_4_ * 0.0;
        auVar38._20_4_ = -auVar158._20_4_ * 0.0;
        auVar38._24_4_ = -auVar158._24_4_ * 0.0;
        auVar38._28_4_ = 0;
        auVar7 = vfmadd213ps_fma(auVar126,auVar126,ZEXT832(0) << 0x20);
        auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar127,auVar127);
        auVar183 = vrsqrtps_avx(ZEXT1632(auVar7));
        auVar110 = ZEXT1632(CONCAT412(fVar118 * 0.0,
                                      CONCAT48(fVar117 * 0.0,CONCAT44(fVar116 * 0.0,fVar140 * 0.0)))
                           );
        fVar140 = auVar183._0_4_;
        fVar116 = auVar183._4_4_;
        fVar117 = auVar183._8_4_;
        fVar118 = auVar183._12_4_;
        fVar119 = auVar183._16_4_;
        fVar120 = auVar183._20_4_;
        fVar121 = auVar183._24_4_;
        auVar39._4_4_ = fVar116 * fVar116 * fVar116 * auVar7._4_4_ * -0.5;
        auVar39._0_4_ = fVar140 * fVar140 * fVar140 * auVar7._0_4_ * -0.5;
        auVar39._8_4_ = fVar117 * fVar117 * fVar117 * auVar7._8_4_ * -0.5;
        auVar39._12_4_ = fVar118 * fVar118 * fVar118 * auVar7._12_4_ * -0.5;
        auVar39._16_4_ = fVar119 * fVar119 * fVar119 * -0.0;
        auVar39._20_4_ = fVar120 * fVar120 * fVar120 * -0.0;
        auVar39._24_4_ = fVar121 * fVar121 * fVar121 * -0.0;
        auVar39._28_4_ = 0xbf000000;
        auVar7 = vfmadd231ps_fma(auVar39,auVar218,auVar183);
        fVar140 = auVar7._0_4_;
        fVar116 = auVar7._4_4_;
        auVar40._4_4_ = fVar116 * auVar127._4_4_;
        auVar40._0_4_ = fVar140 * auVar127._0_4_;
        fVar117 = auVar7._8_4_;
        auVar40._8_4_ = fVar117 * auVar127._8_4_;
        fVar118 = auVar7._12_4_;
        auVar40._12_4_ = fVar118 * auVar127._12_4_;
        auVar40._16_4_ = auVar127._16_4_ * 0.0;
        auVar40._20_4_ = auVar127._20_4_ * 0.0;
        auVar40._24_4_ = auVar127._24_4_ * 0.0;
        auVar40._28_4_ = 0x3fc00000;
        auVar41._4_4_ = fVar116 * -auVar126._4_4_;
        auVar41._0_4_ = fVar140 * -auVar126._0_4_;
        auVar41._8_4_ = fVar117 * -auVar126._8_4_;
        auVar41._12_4_ = fVar118 * -auVar126._12_4_;
        auVar41._16_4_ = -auVar126._16_4_ * 0.0;
        auVar41._20_4_ = -auVar126._20_4_ * 0.0;
        auVar41._24_4_ = -auVar126._24_4_ * 0.0;
        auVar41._28_4_ = auVar158._28_4_ ^ 0x80000000;
        auVar42._28_4_ = auVar183._28_4_;
        auVar42._0_28_ =
             ZEXT1628(CONCAT412(fVar118 * 0.0,
                                CONCAT48(fVar117 * 0.0,CONCAT44(fVar116 * 0.0,fVar140 * 0.0))));
        auVar7 = vfmadd213ps_fma(auVar37,ZEXT1632(auVar5),auVar128);
        auVar126 = ZEXT1632(auVar5);
        auVar10 = vfmadd213ps_fma(auVar38,auVar126,local_2e0);
        auVar11 = vfmadd213ps_fma(auVar110,auVar126,ZEXT1632(auVar164));
        auVar142 = vfnmadd213ps_fma(auVar37,auVar126,auVar128);
        auVar101 = vfmadd213ps_fma(auVar40,ZEXT1632(auVar6),auVar103);
        auVar102 = vfnmadd213ps_fma(auVar38,auVar126,local_2e0);
        auVar191 = ZEXT1632(auVar6);
        auVar6 = vfmadd213ps_fma(auVar41,auVar191,local_2c0);
        auVar184 = ZEXT1632(auVar5);
        auVar143 = vfnmadd231ps_fma(ZEXT1632(auVar164),auVar184,auVar110);
        auVar164 = vfmadd213ps_fma(auVar42,auVar191,ZEXT1632(auVar165));
        auVar23 = vfnmadd213ps_fma(auVar40,auVar191,auVar103);
        auVar123 = vfnmadd213ps_fma(auVar41,auVar191,local_2c0);
        auVar144 = vfnmadd231ps_fma(ZEXT1632(auVar165),auVar191,auVar42);
        auVar126 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar102));
        auVar127 = vsubps_avx(ZEXT1632(auVar164),ZEXT1632(auVar143));
        auVar156._0_4_ = auVar126._0_4_ * auVar143._0_4_;
        auVar156._4_4_ = auVar126._4_4_ * auVar143._4_4_;
        auVar156._8_4_ = auVar126._8_4_ * auVar143._8_4_;
        auVar156._12_4_ = auVar126._12_4_ * auVar143._12_4_;
        auVar156._16_4_ = auVar126._16_4_ * 0.0;
        auVar156._20_4_ = auVar126._20_4_ * 0.0;
        auVar156._24_4_ = auVar126._24_4_ * 0.0;
        auVar156._28_4_ = 0;
        auVar5 = vfmsub231ps_fma(auVar156,ZEXT1632(auVar102),auVar127);
        auVar43._4_4_ = auVar142._4_4_ * auVar127._4_4_;
        auVar43._0_4_ = auVar142._0_4_ * auVar127._0_4_;
        auVar43._8_4_ = auVar142._8_4_ * auVar127._8_4_;
        auVar43._12_4_ = auVar142._12_4_ * auVar127._12_4_;
        auVar43._16_4_ = auVar127._16_4_ * 0.0;
        auVar43._20_4_ = auVar127._20_4_ * 0.0;
        auVar43._24_4_ = auVar127._24_4_ * 0.0;
        auVar43._28_4_ = auVar127._28_4_;
        auVar195 = ZEXT1632(auVar142);
        auVar127 = vsubps_avx(ZEXT1632(auVar101),auVar195);
        auVar103 = ZEXT1632(auVar143);
        auVar165 = vfmsub231ps_fma(auVar43,auVar103,auVar127);
        auVar44._4_4_ = auVar102._4_4_ * auVar127._4_4_;
        auVar44._0_4_ = auVar102._0_4_ * auVar127._0_4_;
        auVar44._8_4_ = auVar102._8_4_ * auVar127._8_4_;
        auVar44._12_4_ = auVar102._12_4_ * auVar127._12_4_;
        auVar44._16_4_ = auVar127._16_4_ * 0.0;
        auVar44._20_4_ = auVar127._20_4_ * 0.0;
        auVar44._24_4_ = auVar127._24_4_ * 0.0;
        auVar44._28_4_ = auVar127._28_4_;
        auVar142 = vfmsub231ps_fma(auVar44,auVar195,auVar126);
        auVar165 = vfmadd231ps_fma(ZEXT1632(auVar142),ZEXT832(0) << 0x20,ZEXT1632(auVar165));
        auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),ZEXT832(0) << 0x20,ZEXT1632(auVar5));
        auVar128 = vcmpps_avx(ZEXT1632(auVar165),ZEXT832(0) << 0x20,2);
        auVar126 = vblendvps_avx(ZEXT1632(auVar23),ZEXT1632(auVar7),auVar128);
        auVar127 = vblendvps_avx(ZEXT1632(auVar123),ZEXT1632(auVar10),auVar128);
        auVar183 = vblendvps_avx(ZEXT1632(auVar144),ZEXT1632(auVar11),auVar128);
        auVar158 = vblendvps_avx(auVar195,ZEXT1632(auVar101),auVar128);
        auVar110 = vblendvps_avx(ZEXT1632(auVar102),ZEXT1632(auVar6),auVar128);
        auVar133 = vblendvps_avx(auVar103,ZEXT1632(auVar164),auVar128);
        auVar195 = vblendvps_avx(ZEXT1632(auVar101),auVar195,auVar128);
        auVar112 = vblendvps_avx(ZEXT1632(auVar6),ZEXT1632(auVar102),auVar128);
        auVar165 = vpackssdw_avx(local_380._0_16_,local_380._16_16_);
        auVar103 = vblendvps_avx(ZEXT1632(auVar164),auVar103,auVar128);
        auVar199 = vsubps_avx(auVar195,auVar126);
        auVar112 = vsubps_avx(auVar112,auVar127);
        auVar21 = vsubps_avx(auVar103,auVar183);
        auVar154 = vsubps_avx(auVar126,auVar158);
        auVar155 = vsubps_avx(auVar127,auVar110);
        auVar166 = vsubps_avx(auVar183,auVar133);
        auVar45._4_4_ = auVar126._4_4_ * auVar21._4_4_;
        auVar45._0_4_ = auVar126._0_4_ * auVar21._0_4_;
        auVar45._8_4_ = auVar126._8_4_ * auVar21._8_4_;
        auVar45._12_4_ = auVar126._12_4_ * auVar21._12_4_;
        auVar45._16_4_ = auVar126._16_4_ * auVar21._16_4_;
        auVar45._20_4_ = auVar126._20_4_ * auVar21._20_4_;
        auVar45._24_4_ = auVar126._24_4_ * auVar21._24_4_;
        auVar45._28_4_ = auVar103._28_4_;
        auVar164 = vfmsub231ps_fma(auVar45,auVar183,auVar199);
        auVar46._4_4_ = auVar127._4_4_ * auVar199._4_4_;
        auVar46._0_4_ = auVar127._0_4_ * auVar199._0_4_;
        auVar46._8_4_ = auVar127._8_4_ * auVar199._8_4_;
        auVar46._12_4_ = auVar127._12_4_ * auVar199._12_4_;
        auVar46._16_4_ = auVar127._16_4_ * auVar199._16_4_;
        auVar46._20_4_ = auVar127._20_4_ * auVar199._20_4_;
        auVar46._24_4_ = auVar127._24_4_ * auVar199._24_4_;
        auVar46._28_4_ = auVar195._28_4_;
        auVar5 = vfmsub231ps_fma(auVar46,auVar126,auVar112);
        auVar164 = vfmadd231ps_fma(ZEXT1632(auVar5),ZEXT832(0) << 0x20,ZEXT1632(auVar164));
        auVar107._0_4_ = auVar112._0_4_ * auVar183._0_4_;
        auVar107._4_4_ = auVar112._4_4_ * auVar183._4_4_;
        auVar107._8_4_ = auVar112._8_4_ * auVar183._8_4_;
        auVar107._12_4_ = auVar112._12_4_ * auVar183._12_4_;
        auVar107._16_4_ = auVar112._16_4_ * auVar183._16_4_;
        auVar107._20_4_ = auVar112._20_4_ * auVar183._20_4_;
        auVar107._24_4_ = auVar112._24_4_ * auVar183._24_4_;
        auVar107._28_4_ = 0;
        auVar5 = vfmsub231ps_fma(auVar107,auVar127,auVar21);
        auVar5 = vfmadd231ps_fma(ZEXT1632(auVar164),ZEXT832(0) << 0x20,ZEXT1632(auVar5));
        auVar108._0_4_ = auVar166._0_4_ * auVar158._0_4_;
        auVar108._4_4_ = auVar166._4_4_ * auVar158._4_4_;
        auVar108._8_4_ = auVar166._8_4_ * auVar158._8_4_;
        auVar108._12_4_ = auVar166._12_4_ * auVar158._12_4_;
        auVar108._16_4_ = auVar166._16_4_ * auVar158._16_4_;
        auVar108._20_4_ = auVar166._20_4_ * auVar158._20_4_;
        auVar108._24_4_ = auVar166._24_4_ * auVar158._24_4_;
        auVar108._28_4_ = 0;
        auVar164 = vfmsub231ps_fma(auVar108,auVar154,auVar133);
        auVar47._4_4_ = auVar155._4_4_ * auVar133._4_4_;
        auVar47._0_4_ = auVar155._0_4_ * auVar133._0_4_;
        auVar47._8_4_ = auVar155._8_4_ * auVar133._8_4_;
        auVar47._12_4_ = auVar155._12_4_ * auVar133._12_4_;
        auVar47._16_4_ = auVar155._16_4_ * auVar133._16_4_;
        auVar47._20_4_ = auVar155._20_4_ * auVar133._20_4_;
        auVar47._24_4_ = auVar155._24_4_ * auVar133._24_4_;
        auVar47._28_4_ = auVar133._28_4_;
        auVar6 = vfmsub231ps_fma(auVar47,auVar110,auVar166);
        auVar48._4_4_ = auVar154._4_4_ * auVar110._4_4_;
        auVar48._0_4_ = auVar154._0_4_ * auVar110._0_4_;
        auVar48._8_4_ = auVar154._8_4_ * auVar110._8_4_;
        auVar48._12_4_ = auVar154._12_4_ * auVar110._12_4_;
        auVar48._16_4_ = auVar154._16_4_ * auVar110._16_4_;
        auVar48._20_4_ = auVar154._20_4_ * auVar110._20_4_;
        auVar48._24_4_ = auVar154._24_4_ * auVar110._24_4_;
        auVar48._28_4_ = auVar110._28_4_;
        auVar7 = vfmsub231ps_fma(auVar48,auVar155,auVar158);
        auVar110 = ZEXT832(0) << 0x20;
        auVar164 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar110,ZEXT1632(auVar164));
        auVar6 = vfmadd231ps_fma(ZEXT1632(auVar164),auVar110,ZEXT1632(auVar6));
        auVar158 = vmaxps_avx(ZEXT1632(auVar5),ZEXT1632(auVar6));
        auVar158 = vcmpps_avx(auVar158,auVar110,2);
        auVar164 = vpackssdw_avx(auVar158._0_16_,auVar158._16_16_);
        auVar165 = vpand_avx(auVar164,auVar165);
        auVar158 = vpmovsxwd_avx2(auVar165);
        if ((((((((auVar158 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar158 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar158 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar158 >> 0x7f,0) == '\0') &&
              (auVar158 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar158 >> 0xbf,0) == '\0') &&
            (auVar158 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar158[0x1f]) {
LAB_018d7ef1:
          auVar173 = ZEXT3264(CONCAT824(uStack_548,
                                        CONCAT816(uStack_550,CONCAT88(uStack_558,local_560))));
        }
        else {
          auVar49._4_4_ = auVar112._4_4_ * auVar166._4_4_;
          auVar49._0_4_ = auVar112._0_4_ * auVar166._0_4_;
          auVar49._8_4_ = auVar112._8_4_ * auVar166._8_4_;
          auVar49._12_4_ = auVar112._12_4_ * auVar166._12_4_;
          auVar49._16_4_ = auVar112._16_4_ * auVar166._16_4_;
          auVar49._20_4_ = auVar112._20_4_ * auVar166._20_4_;
          auVar49._24_4_ = auVar112._24_4_ * auVar166._24_4_;
          auVar49._28_4_ = auVar158._28_4_;
          auVar11 = vfmsub231ps_fma(auVar49,auVar155,auVar21);
          auVar131._0_4_ = auVar154._0_4_ * auVar21._0_4_;
          auVar131._4_4_ = auVar154._4_4_ * auVar21._4_4_;
          auVar131._8_4_ = auVar154._8_4_ * auVar21._8_4_;
          auVar131._12_4_ = auVar154._12_4_ * auVar21._12_4_;
          auVar131._16_4_ = auVar154._16_4_ * auVar21._16_4_;
          auVar131._20_4_ = auVar154._20_4_ * auVar21._20_4_;
          auVar131._24_4_ = auVar154._24_4_ * auVar21._24_4_;
          auVar131._28_4_ = 0;
          auVar10 = vfmsub231ps_fma(auVar131,auVar199,auVar166);
          auVar50._4_4_ = auVar155._4_4_ * auVar199._4_4_;
          auVar50._0_4_ = auVar155._0_4_ * auVar199._0_4_;
          auVar50._8_4_ = auVar155._8_4_ * auVar199._8_4_;
          auVar50._12_4_ = auVar155._12_4_ * auVar199._12_4_;
          auVar50._16_4_ = auVar155._16_4_ * auVar199._16_4_;
          auVar50._20_4_ = auVar155._20_4_ * auVar199._20_4_;
          auVar50._24_4_ = auVar155._24_4_ * auVar199._24_4_;
          auVar50._28_4_ = auVar127._28_4_;
          auVar101 = vfmsub231ps_fma(auVar50,auVar154,auVar112);
          auVar164 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar10),ZEXT1632(auVar101));
          auVar7 = vfmadd231ps_fma(ZEXT1632(auVar164),ZEXT1632(auVar11),auVar110);
          auVar158 = vrcpps_avx(ZEXT1632(auVar7));
          auVar208._8_4_ = 0x3f800000;
          auVar208._0_8_ = 0x3f8000003f800000;
          auVar208._12_4_ = 0x3f800000;
          auVar208._16_4_ = 0x3f800000;
          auVar208._20_4_ = 0x3f800000;
          auVar208._24_4_ = 0x3f800000;
          auVar208._28_4_ = 0x3f800000;
          auVar164 = vfnmadd213ps_fma(auVar158,ZEXT1632(auVar7),auVar208);
          auVar164 = vfmadd132ps_fma(ZEXT1632(auVar164),auVar158,auVar158);
          auVar185._0_4_ = auVar101._0_4_ * auVar183._0_4_;
          auVar185._4_4_ = auVar101._4_4_ * auVar183._4_4_;
          auVar185._8_4_ = auVar101._8_4_ * auVar183._8_4_;
          auVar185._12_4_ = auVar101._12_4_ * auVar183._12_4_;
          auVar185._16_4_ = auVar183._16_4_ * 0.0;
          auVar185._20_4_ = auVar183._20_4_ * 0.0;
          auVar185._24_4_ = auVar183._24_4_ * 0.0;
          auVar185._28_4_ = 0;
          auVar10 = vfmadd231ps_fma(auVar185,auVar127,ZEXT1632(auVar10));
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT1632(auVar11),auVar126);
          fVar140 = auVar164._0_4_;
          fVar116 = auVar164._4_4_;
          fVar117 = auVar164._8_4_;
          fVar118 = auVar164._12_4_;
          auVar51._28_4_ = auVar21._28_4_;
          auVar51._0_28_ =
               ZEXT1628(CONCAT412(fVar118 * auVar10._12_4_,
                                  CONCAT48(fVar117 * auVar10._8_4_,
                                           CONCAT44(fVar116 * auVar10._4_4_,fVar140 * auVar10._0_4_)
                                          )));
          auVar109._4_4_ = uVar94;
          auVar109._0_4_ = uVar94;
          auVar109._8_4_ = uVar94;
          auVar109._12_4_ = uVar94;
          auVar109._16_4_ = uVar94;
          auVar109._20_4_ = uVar94;
          auVar109._24_4_ = uVar94;
          auVar109._28_4_ = uVar94;
          uVar99 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar132._4_4_ = uVar99;
          auVar132._0_4_ = uVar99;
          auVar132._8_4_ = uVar99;
          auVar132._12_4_ = uVar99;
          auVar132._16_4_ = uVar99;
          auVar132._20_4_ = uVar99;
          auVar132._24_4_ = uVar99;
          auVar132._28_4_ = uVar99;
          auVar127 = vcmpps_avx(auVar109,auVar51,2);
          auVar158 = vcmpps_avx(auVar51,auVar132,2);
          auVar127 = vandps_avx(auVar158,auVar127);
          auVar164 = vpackssdw_avx(auVar127._0_16_,auVar127._16_16_);
          auVar165 = vpand_avx(auVar165,auVar164);
          auVar127 = vpmovsxwd_avx2(auVar165);
          if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar127 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar127 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar127 >> 0x7f,0) == '\0') &&
                (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar127 >> 0xbf,0) == '\0') &&
              (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar127[0x1f]) goto LAB_018d7ef1;
          auVar127 = vcmpps_avx(ZEXT1632(auVar7),ZEXT832(0) << 0x20,4);
          auVar164 = vpackssdw_avx(auVar127._0_16_,auVar127._16_16_);
          auVar165 = vpand_avx(auVar165,auVar164);
          auVar127 = vpmovsxwd_avx2(auVar165);
          auVar173 = ZEXT3264(CONCAT824(uStack_548,
                                        CONCAT816(uStack_550,CONCAT88(uStack_558,local_560))));
          if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar127 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar127 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar127 >> 0x7f,0) != '\0') ||
                (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar127 >> 0xbf,0) != '\0') ||
              (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar127[0x1f] < '\0') {
            auVar110 = ZEXT1632(CONCAT412(fVar118 * auVar5._12_4_,
                                          CONCAT48(fVar117 * auVar5._8_4_,
                                                   CONCAT44(fVar116 * auVar5._4_4_,
                                                            fVar140 * auVar5._0_4_))));
            auVar133 = ZEXT1632(CONCAT412(fVar118 * auVar6._12_4_,
                                          CONCAT48(fVar117 * auVar6._8_4_,
                                                   CONCAT44(fVar116 * auVar6._4_4_,
                                                            fVar140 * auVar6._0_4_))));
            auVar172._8_4_ = 0x3f800000;
            auVar172._0_8_ = 0x3f8000003f800000;
            auVar172._12_4_ = 0x3f800000;
            auVar172._16_4_ = 0x3f800000;
            auVar172._20_4_ = 0x3f800000;
            auVar172._24_4_ = 0x3f800000;
            auVar172._28_4_ = 0x3f800000;
            auVar158 = vsubps_avx(auVar172,auVar110);
            _local_120 = vblendvps_avx(auVar158,auVar110,auVar128);
            auVar158 = vsubps_avx(auVar172,auVar133);
            local_3a0 = vblendvps_avx(auVar158,auVar133,auVar128);
            auVar173 = ZEXT3264(auVar127);
            local_520 = auVar51;
          }
        }
        auVar222 = ZEXT3264(auVar220);
        auVar219 = ZEXT3264(auVar217);
        auVar213 = ZEXT3264(_local_680);
        auVar209 = ZEXT3264(local_7c0);
        auVar206 = ZEXT3264(auVar167);
        auVar202 = ZEXT3264(local_6c0);
        auVar127 = auVar173._0_32_;
        if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar127 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar127 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar127 >> 0x7f,0) != '\0') ||
              (auVar173 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar127 >> 0xbf,0) != '\0') ||
            (auVar173 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar173[0x1f] < '\0') {
          auVar158 = vsubps_avx(auVar191,auVar184);
          auVar165 = vfmadd213ps_fma(auVar158,_local_120,auVar184);
          fVar140 = *(float *)((long)local_7c8->ray_space + k * 4 + -0x10);
          auVar52._4_4_ = (auVar165._4_4_ + auVar165._4_4_) * fVar140;
          auVar52._0_4_ = (auVar165._0_4_ + auVar165._0_4_) * fVar140;
          auVar52._8_4_ = (auVar165._8_4_ + auVar165._8_4_) * fVar140;
          auVar52._12_4_ = (auVar165._12_4_ + auVar165._12_4_) * fVar140;
          auVar52._16_4_ = fVar140 * 0.0;
          auVar52._20_4_ = fVar140 * 0.0;
          auVar52._24_4_ = fVar140 * 0.0;
          auVar52._28_4_ = 0;
          auVar158 = vcmpps_avx(local_520,auVar52,6);
          auVar110 = auVar127 & auVar158;
          if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar110 >> 0x7f,0) != '\0') ||
                (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar110 >> 0xbf,0) != '\0') ||
              (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar110[0x1f] < '\0') {
            auVar134._8_4_ = 0xbf800000;
            auVar134._0_8_ = 0xbf800000bf800000;
            auVar134._12_4_ = 0xbf800000;
            auVar134._16_4_ = 0xbf800000;
            auVar134._20_4_ = 0xbf800000;
            auVar134._24_4_ = 0xbf800000;
            auVar134._28_4_ = 0xbf800000;
            auVar157._8_4_ = 0x40000000;
            auVar157._0_8_ = 0x4000000040000000;
            auVar157._12_4_ = 0x40000000;
            auVar157._16_4_ = 0x40000000;
            auVar157._20_4_ = 0x40000000;
            auVar157._24_4_ = 0x40000000;
            auVar157._28_4_ = 0x40000000;
            auVar165 = vfmadd213ps_fma(local_3a0,auVar157,auVar134);
            local_280 = _local_120;
            local_3a0 = ZEXT1632(auVar165);
            auVar110 = local_3a0;
            local_260 = ZEXT1632(auVar165);
            local_240 = local_520;
            local_220 = 0;
            local_21c = iVar15;
            local_210 = local_7f0;
            uStack_208 = uStack_7e8;
            local_200 = local_810;
            uStack_1f8 = uStack_808;
            local_1f0 = local_820;
            uStack_1e8 = uStack_818;
            local_1e0 = local_800;
            uStack_1d8 = uStack_7f8;
            local_3a0 = auVar110;
            if ((pGVar98->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              local_5a0 = vandps_avx(auVar158,auVar127);
              fVar140 = 1.0 / auVar105._0_4_;
              local_1a0[0] = fVar140 * ((float)local_120._0_4_ + 0.0);
              local_1a0[1] = fVar140 * ((float)local_120._4_4_ + 1.0);
              local_1a0[2] = fVar140 * (fStack_118 + 2.0);
              local_1a0[3] = fVar140 * (fStack_114 + 3.0);
              fStack_190 = fVar140 * (fStack_110 + 4.0);
              fStack_18c = fVar140 * (fStack_10c + 5.0);
              fStack_188 = fVar140 * (fStack_108 + 6.0);
              fStack_184 = fStack_104 + 7.0;
              local_3a0._0_8_ = auVar165._0_8_;
              local_3a0._8_8_ = auVar165._8_8_;
              local_180 = local_3a0._0_8_;
              uStack_178 = local_3a0._8_8_;
              uStack_170 = 0;
              uStack_168 = 0;
              local_160 = local_520;
              auVar135._8_4_ = 0x7f800000;
              auVar135._0_8_ = 0x7f8000007f800000;
              auVar135._12_4_ = 0x7f800000;
              auVar135._16_4_ = 0x7f800000;
              auVar135._20_4_ = 0x7f800000;
              auVar135._24_4_ = 0x7f800000;
              auVar135._28_4_ = 0x7f800000;
              auVar127 = vblendvps_avx(auVar135,local_520,local_5a0);
              auVar158 = vshufps_avx(auVar127,auVar127,0xb1);
              auVar158 = vminps_avx(auVar127,auVar158);
              auVar110 = vshufpd_avx(auVar158,auVar158,5);
              auVar158 = vminps_avx(auVar158,auVar110);
              auVar110 = vpermpd_avx2(auVar158,0x4e);
              auVar158 = vminps_avx(auVar158,auVar110);
              auVar158 = vcmpps_avx(auVar127,auVar158,0);
              auVar110 = local_5a0 & auVar158;
              auVar127 = local_5a0;
              if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar110 >> 0x7f,0) != '\0') ||
                    (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar110 >> 0xbf,0) != '\0') ||
                  (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar110[0x1f] < '\0') {
                auVar127 = vandps_avx(auVar158,local_5a0);
              }
              uVar92 = vmovmskps_avx(auVar127);
              uVar94 = 0;
              for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
                uVar94 = uVar94 + 1;
              }
              uVar93 = (ulong)uVar94;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar98->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar140 = local_1a0[uVar93];
                uVar99 = *(undefined4 *)((long)&local_180 + uVar93 * 4);
                fVar117 = 1.0 - fVar140;
                fVar116 = fVar117 * fVar117 * -3.0;
                auVar165 = vfmadd231ss_fma(ZEXT416((uint)(fVar117 * fVar117)),
                                           ZEXT416((uint)(fVar140 * fVar117)),ZEXT416(0xc0000000));
                auVar164 = vfmsub132ss_fma(ZEXT416((uint)(fVar140 * fVar117)),
                                           ZEXT416((uint)(fVar140 * fVar140)),ZEXT416(0x40000000));
                fVar117 = auVar165._0_4_ * 3.0;
                fVar118 = auVar164._0_4_ * 3.0;
                fVar119 = fVar140 * fVar140 * 3.0;
                auVar174._0_4_ = fVar119 * fVar115;
                auVar174._4_4_ = fVar119 * fVar197;
                auVar174._8_4_ = fVar119 * fVar203;
                auVar174._12_4_ = fVar119 * fVar204;
                auVar146._4_4_ = fVar118;
                auVar146._0_4_ = fVar118;
                auVar146._8_4_ = fVar118;
                auVar146._12_4_ = fVar118;
                auVar165 = vfmadd132ps_fma(auVar146,auVar174,auVar8);
                auVar162._4_4_ = fVar117;
                auVar162._0_4_ = fVar117;
                auVar162._8_4_ = fVar117;
                auVar162._12_4_ = fVar117;
                auVar165 = vfmadd132ps_fma(auVar162,auVar165,auVar122);
                auVar147._4_4_ = fVar116;
                auVar147._0_4_ = fVar116;
                auVar147._8_4_ = fVar116;
                auVar147._12_4_ = fVar116;
                auVar165 = vfmadd132ps_fma(auVar147,auVar165,auVar9);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar93 * 4);
                *(int *)(ray + k * 4 + 0xc0) = auVar165._0_4_;
                uVar16 = vextractps_avx(auVar165,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar16;
                uVar16 = vextractps_avx(auVar165,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar16;
                *(float *)(ray + k * 4 + 0xf0) = fVar140;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar99;
                *(uint *)(ray + k * 4 + 0x110) = uVar14;
                *(uint *)(ray + k * 4 + 0x120) = uVar13;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                local_6e0._4_4_ = uVar13;
                local_6e0._0_4_ = uVar13;
                local_6e0._8_4_ = uVar13;
                local_6e0._16_16_ = auVar183._16_16_;
                local_6e0._12_4_ = uVar13;
                local_600._0_8_ = CONCAT44(uVar14,uVar14);
                local_600 = ZEXT1632(CONCAT412(uVar14,CONCAT48(uVar14,local_600._0_8_)));
                local_620 = ZEXT1632(*local_708);
                auStack_870 = auVar126._16_16_;
                local_880 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                local_760 = auVar217;
                local_660 = auVar167;
                local_640 = auVar220;
                while( true ) {
                  auVar126 = _local_880;
                  local_420 = local_1a0[uVar93];
                  local_410 = *(undefined4 *)((long)&local_180 + uVar93 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar93 * 4);
                  fVar117 = 1.0 - local_420;
                  auVar164 = vfmadd231ss_fma(ZEXT416((uint)(fVar117 * fVar117)),
                                             ZEXT416((uint)(local_420 * fVar117)),
                                             ZEXT416(0xc0000000));
                  auVar165 = vfmsub132ss_fma(ZEXT416((uint)(local_420 * fVar117)),
                                             ZEXT416((uint)(local_420 * local_420)),
                                             ZEXT416(0x40000000));
                  fVar140 = auVar165._0_4_ * 3.0;
                  fVar116 = local_420 * local_420 * 3.0;
                  auVar177._0_4_ = fVar116 * fVar115;
                  auVar177._4_4_ = fVar116 * fVar197;
                  auVar177._8_4_ = fVar116 * fVar203;
                  auVar177._12_4_ = fVar116 * fVar204;
                  auVar152._4_4_ = fVar140;
                  auVar152._0_4_ = fVar140;
                  auVar152._8_4_ = fVar140;
                  auVar152._12_4_ = fVar140;
                  auVar165 = vfmadd132ps_fma(auVar152,auVar177,auVar8);
                  fVar140 = auVar164._0_4_ * 3.0;
                  auVar171._4_4_ = fVar140;
                  auVar171._0_4_ = fVar140;
                  auVar171._8_4_ = fVar140;
                  auVar171._12_4_ = fVar140;
                  auVar165 = vfmadd132ps_fma(auVar171,auVar165,auVar122);
                  fVar140 = fVar117 * fVar117 * -3.0;
                  local_790.context = context->user;
                  auVar153._4_4_ = fVar140;
                  auVar153._0_4_ = fVar140;
                  auVar153._8_4_ = fVar140;
                  auVar153._12_4_ = fVar140;
                  auVar164 = vfmadd132ps_fma(auVar153,auVar165,auVar9);
                  local_450 = auVar164._0_4_;
                  uStack_44c = local_450;
                  uStack_448 = local_450;
                  uStack_444 = local_450;
                  auVar165 = vshufps_avx(auVar164,auVar164,0x55);
                  local_440 = auVar165;
                  local_430 = vshufps_avx(auVar164,auVar164,0xaa);
                  fStack_41c = local_420;
                  fStack_418 = local_420;
                  fStack_414 = local_420;
                  uStack_40c = local_410;
                  uStack_408 = local_410;
                  uStack_404 = local_410;
                  local_400 = local_600._0_8_;
                  uStack_3f8 = local_600._8_8_;
                  local_3f0 = local_6e0._0_16_;
                  vpcmpeqd_avx2(ZEXT1632(local_6e0._0_16_),ZEXT1632(local_6e0._0_16_));
                  uStack_3dc = (local_790.context)->instID[0];
                  local_3e0 = uStack_3dc;
                  uStack_3d8 = uStack_3dc;
                  uStack_3d4 = uStack_3dc;
                  uStack_3d0 = (local_790.context)->instPrimID[0];
                  uStack_3cc = uStack_3d0;
                  uStack_3c8 = uStack_3d0;
                  uStack_3c4 = uStack_3d0;
                  local_7e0 = local_620._0_16_;
                  local_790.valid = (int *)local_7e0;
                  local_790.geometryUserPtr = pGVar98->userPtr;
                  local_790.hit = (RTCHitN *)&local_450;
                  local_790.N = 4;
                  local_790.ray = (RTCRayN *)ray;
                  if (pGVar98->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar98->intersectionFilterN)(&local_790);
                    auVar213 = ZEXT3264(_local_680);
                    auVar219 = ZEXT3264(local_760);
                    auVar206 = ZEXT3264(local_660);
                    auVar222 = ZEXT3264(local_640);
                    auVar209 = ZEXT3264(local_7c0);
                    auVar202 = ZEXT3264(local_6c0);
                    prim = local_7d0;
                  }
                  if (local_7e0 == (undefined1  [16])0x0) {
                    auVar165 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                    auVar165 = auVar165 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var20 = context->args->filter;
                    if ((p_Var20 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar98->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var20)(&local_790);
                      auVar213 = ZEXT3264(_local_680);
                      auVar219 = ZEXT3264(local_760);
                      auVar206 = ZEXT3264(local_660);
                      auVar222 = ZEXT3264(local_640);
                      auVar209 = ZEXT3264(local_7c0);
                      auVar202 = ZEXT3264(local_6c0);
                      prim = local_7d0;
                    }
                    auVar164 = vpcmpeqd_avx(local_7e0,_DAT_01f7aa10);
                    auVar5 = vpcmpeqd_avx(auVar165,auVar165);
                    auVar165 = auVar164 ^ auVar5;
                    if (local_7e0 != (undefined1  [16])0x0) {
                      auVar164 = auVar164 ^ auVar5;
                      auVar5 = vmaskmovps_avx(auVar164,*(undefined1 (*) [16])local_790.hit);
                      *(undefined1 (*) [16])(local_790.ray + 0xc0) = auVar5;
                      auVar5 = vmaskmovps_avx(auVar164,*(undefined1 (*) [16])(local_790.hit + 0x10))
                      ;
                      *(undefined1 (*) [16])(local_790.ray + 0xd0) = auVar5;
                      auVar5 = vmaskmovps_avx(auVar164,*(undefined1 (*) [16])(local_790.hit + 0x20))
                      ;
                      *(undefined1 (*) [16])(local_790.ray + 0xe0) = auVar5;
                      auVar5 = vmaskmovps_avx(auVar164,*(undefined1 (*) [16])(local_790.hit + 0x30))
                      ;
                      *(undefined1 (*) [16])(local_790.ray + 0xf0) = auVar5;
                      auVar5 = vmaskmovps_avx(auVar164,*(undefined1 (*) [16])(local_790.hit + 0x40))
                      ;
                      *(undefined1 (*) [16])(local_790.ray + 0x100) = auVar5;
                      auVar5 = vmaskmovps_avx(auVar164,*(undefined1 (*) [16])(local_790.hit + 0x50))
                      ;
                      *(undefined1 (*) [16])(local_790.ray + 0x110) = auVar5;
                      auVar5 = vmaskmovps_avx(auVar164,*(undefined1 (*) [16])(local_790.hit + 0x60))
                      ;
                      *(undefined1 (*) [16])(local_790.ray + 0x120) = auVar5;
                      auVar5 = vmaskmovps_avx(auVar164,*(undefined1 (*) [16])(local_790.hit + 0x70))
                      ;
                      *(undefined1 (*) [16])(local_790.ray + 0x130) = auVar5;
                      auVar164 = vmaskmovps_avx(auVar164,*(undefined1 (*) [16])
                                                          (local_790.hit + 0x80));
                      *(undefined1 (*) [16])(local_790.ray + 0x140) = auVar164;
                    }
                  }
                  auVar127 = local_520;
                  auVar220 = auVar222._0_32_;
                  auVar217 = auVar219._0_32_;
                  auVar167 = auVar206._0_32_;
                  auVar125._8_8_ = 0x100000001;
                  auVar125._0_8_ = 0x100000001;
                  if ((auVar125 & auVar165) == (undefined1  [16])0x0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_880._0_4_;
                  }
                  else {
                    local_880._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_880._4_4_ = 0;
                    local_880._8_4_ = 0;
                    local_880._12_4_ = 0;
                  }
                  *(undefined4 *)(local_5a0 + uVar93 * 4) = 0;
                  auStack_870 = auVar126._16_16_;
                  auVar114._4_4_ = local_880._0_4_;
                  auVar114._0_4_ = local_880._0_4_;
                  auVar114._8_4_ = local_880._0_4_;
                  auVar114._12_4_ = local_880._0_4_;
                  auVar114._16_4_ = local_880._0_4_;
                  auVar114._20_4_ = local_880._0_4_;
                  auVar114._24_4_ = local_880._0_4_;
                  auVar114._28_4_ = local_880._0_4_;
                  auVar183 = vcmpps_avx(auVar127,auVar114,2);
                  auVar126 = vandps_avx(auVar183,local_5a0);
                  local_5a0 = local_5a0 & auVar183;
                  if ((((((((local_5a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_5a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_5a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_5a0 >> 0x7f,0) == '\0') &&
                        (local_5a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_5a0 >> 0xbf,0) == '\0') &&
                      (local_5a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_5a0[0x1f]) break;
                  auVar139._8_4_ = 0x7f800000;
                  auVar139._0_8_ = 0x7f8000007f800000;
                  auVar139._12_4_ = 0x7f800000;
                  auVar139._16_4_ = 0x7f800000;
                  auVar139._20_4_ = 0x7f800000;
                  auVar139._24_4_ = 0x7f800000;
                  auVar139._28_4_ = 0x7f800000;
                  auVar127 = vblendvps_avx(auVar139,auVar127,auVar126);
                  auVar183 = vshufps_avx(auVar127,auVar127,0xb1);
                  auVar183 = vminps_avx(auVar127,auVar183);
                  auVar158 = vshufpd_avx(auVar183,auVar183,5);
                  auVar183 = vminps_avx(auVar183,auVar158);
                  auVar158 = vpermpd_avx2(auVar183,0x4e);
                  auVar183 = vminps_avx(auVar183,auVar158);
                  auVar183 = vcmpps_avx(auVar127,auVar183,0);
                  auVar158 = auVar126 & auVar183;
                  auVar127 = auVar126;
                  if ((((((((auVar158 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar158 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar158 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar158 >> 0x7f,0) != '\0') ||
                        (auVar158 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar158 >> 0xbf,0) != '\0') ||
                      (auVar158 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar158[0x1f] < '\0') {
                    auVar127 = vandps_avx(auVar183,auVar126);
                  }
                  uVar92 = vmovmskps_avx(auVar127);
                  uVar94 = 0;
                  for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
                    uVar94 = uVar94 + 1;
                  }
                  uVar93 = (ulong)uVar94;
                  local_5a0 = auVar126;
                }
              }
            }
          }
        }
      }
      if (8 < iVar15) {
        _local_680 = auVar213._0_32_;
        local_300._4_4_ = iVar15;
        local_300._0_4_ = iVar15;
        local_300._8_4_ = iVar15;
        local_300._12_4_ = iVar15;
        local_300._16_4_ = iVar15;
        local_300._20_4_ = iVar15;
        local_300._24_4_ = iVar15;
        local_300._28_4_ = iVar15;
        local_360 = fVar141;
        fStack_35c = fVar141;
        fStack_358 = fVar141;
        fStack_354 = fVar141;
        fStack_350 = fVar141;
        fStack_34c = fVar141;
        fStack_348 = fVar141;
        fStack_344 = fVar141;
        local_380._4_4_ = local_740._0_4_;
        local_380._0_4_ = local_740._0_4_;
        local_380._8_4_ = local_740._0_4_;
        local_380._12_4_ = local_740._0_4_;
        local_380._16_4_ = local_740._0_4_;
        local_380._20_4_ = local_740._0_4_;
        local_380._24_4_ = local_740._0_4_;
        local_380._28_4_ = local_740._0_4_;
        local_100 = 1.0 / (float)local_690._0_4_;
        fStack_fc = local_100;
        fStack_f8 = local_100;
        fStack_f4 = local_100;
        fStack_f0 = local_100;
        fStack_ec = local_100;
        fStack_e8 = local_100;
        fStack_e4 = local_100;
        local_690._4_4_ = uVar13;
        local_690._0_4_ = uVar13;
        uStack_688 = uVar13;
        uStack_684 = uVar13;
        local_2a0 = uVar14;
        uStack_29c = uVar14;
        uStack_298 = uVar14;
        uStack_294 = uVar14;
        lVar97 = 8;
        local_760 = auVar217;
        local_660 = auVar167;
        local_640 = auVar220;
        do {
          auVar126 = *(undefined1 (*) [32])(bezier_basis0 + lVar97 * 4 + lVar22);
          auVar127 = *(undefined1 (*) [32])(lVar22 + 0x21aa768 + lVar97 * 4);
          local_740._0_32_ = *(undefined1 (*) [32])(lVar22 + 0x21aabec + lVar97 * 4);
          pauVar2 = (undefined1 (*) [32])(lVar22 + 0x21ab070 + lVar97 * 4);
          auVar90 = *(undefined1 (*) [28])*pauVar2;
          auVar219._0_4_ = local_4a0 * *(float *)*pauVar2;
          auVar219._4_4_ = fStack_49c * *(float *)(*pauVar2 + 4);
          auVar219._8_4_ = fStack_498 * *(float *)(*pauVar2 + 8);
          auVar219._12_4_ = fStack_494 * *(float *)(*pauVar2 + 0xc);
          auVar219._16_4_ = fStack_490 * *(float *)(*pauVar2 + 0x10);
          auVar219._20_4_ = fStack_48c * *(float *)(*pauVar2 + 0x14);
          auVar219._28_36_ = auVar213._28_36_;
          auVar219._24_4_ = fStack_488 * *(float *)(*pauVar2 + 0x18);
          auVar53._4_4_ = local_480._4_4_ * *(float *)(*pauVar2 + 4);
          auVar53._0_4_ = (float)local_480 * *(float *)*pauVar2;
          auVar53._8_4_ = (float)uStack_478 * *(float *)(*pauVar2 + 8);
          auVar53._12_4_ = uStack_478._4_4_ * *(float *)(*pauVar2 + 0xc);
          auVar53._16_4_ = (float)uStack_470 * *(float *)(*pauVar2 + 0x10);
          auVar53._20_4_ = uStack_470._4_4_ * *(float *)(*pauVar2 + 0x14);
          auVar53._24_4_ = (float)uStack_468 * *(float *)(*pauVar2 + 0x18);
          auVar53._28_4_ = *(undefined4 *)(*pauVar2 + 0x1c);
          auVar165 = vfmadd231ps_fma(auVar219._0_32_,local_740._0_32_,local_700);
          auVar164 = vfmadd231ps_fma(auVar53,local_740._0_32_,local_5c0);
          auVar199 = auVar202._0_32_;
          auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar127,auVar199);
          auVar164 = vfmadd231ps_fma(ZEXT1632(auVar164),auVar127,local_4e0);
          auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar126,auVar209._0_32_);
          auVar164 = vfmadd231ps_fma(ZEXT1632(auVar164),auVar126,local_500);
          auVar183 = *(undefined1 (*) [32])(bezier_basis1 + lVar97 * 4 + lVar22);
          auVar158 = *(undefined1 (*) [32])(lVar22 + 0x21acb88 + lVar97 * 4);
          auVar110 = *(undefined1 (*) [32])(lVar22 + 0x21ad00c + lVar97 * 4);
          pfVar1 = (float *)(lVar22 + 0x21ad490 + lVar97 * 4);
          fVar121 = *pfVar1;
          fVar85 = pfVar1[1];
          fVar86 = pfVar1[2];
          fVar210 = pfVar1[3];
          fVar214 = pfVar1[4];
          fVar87 = pfVar1[5];
          fVar88 = pfVar1[6];
          auVar206._0_4_ = local_4a0 * fVar121;
          auVar206._4_4_ = fStack_49c * fVar85;
          auVar206._8_4_ = fStack_498 * fVar86;
          auVar206._12_4_ = fStack_494 * fVar210;
          auVar206._16_4_ = fStack_490 * fVar214;
          auVar206._20_4_ = fStack_48c * fVar87;
          auVar206._28_36_ = auVar209._28_36_;
          auVar206._24_4_ = fStack_488 * fVar88;
          auVar54._4_4_ = fVar85 * local_480._4_4_;
          auVar54._0_4_ = fVar121 * (float)local_480;
          auVar54._8_4_ = fVar86 * (float)uStack_478;
          auVar54._12_4_ = fVar210 * uStack_478._4_4_;
          auVar54._16_4_ = fVar214 * (float)uStack_470;
          auVar54._20_4_ = fVar87 * uStack_470._4_4_;
          auVar54._24_4_ = fVar88 * (float)uStack_468;
          auVar54._28_4_ = uStack_468._4_4_;
          auVar5 = vfmadd231ps_fma(auVar206._0_32_,auVar110,local_700);
          auVar6 = vfmadd231ps_fma(auVar54,auVar110,local_5c0);
          auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar158,auVar199);
          auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar158,local_4e0);
          auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar183,auVar209._0_32_);
          auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar183,local_500);
          local_620 = ZEXT1632(auVar5);
          local_2e0 = ZEXT1632(auVar165);
          auVar195 = vsubps_avx(local_620,local_2e0);
          local_600 = ZEXT1632(auVar6);
          local_2c0 = ZEXT1632(auVar164);
          auVar112 = vsubps_avx(local_600,local_2c0);
          auVar84._4_4_ = auVar164._4_4_ * auVar195._4_4_;
          auVar84._0_4_ = auVar164._0_4_ * auVar195._0_4_;
          auVar84._8_4_ = auVar164._8_4_ * auVar195._8_4_;
          auVar84._12_4_ = auVar164._12_4_ * auVar195._12_4_;
          auVar84._16_4_ = auVar195._16_4_ * 0.0;
          auVar84._20_4_ = auVar195._20_4_ * 0.0;
          auVar84._24_4_ = auVar195._24_4_ * 0.0;
          auVar84._28_4_ = local_4e0._28_4_;
          fVar141 = auVar112._0_4_;
          fVar140 = auVar112._4_4_;
          auVar83._4_4_ = auVar165._4_4_ * fVar140;
          auVar83._0_4_ = auVar165._0_4_ * fVar141;
          fVar116 = auVar112._8_4_;
          auVar83._8_4_ = auVar165._8_4_ * fVar116;
          fVar117 = auVar112._12_4_;
          auVar83._12_4_ = auVar165._12_4_ * fVar117;
          fVar118 = auVar112._16_4_;
          auVar83._16_4_ = fVar118 * 0.0;
          fVar119 = auVar112._20_4_;
          auVar83._20_4_ = fVar119 * 0.0;
          fVar120 = auVar112._24_4_;
          auVar83._24_4_ = fVar120 * 0.0;
          auVar83._28_4_ = local_700._28_4_;
          auVar213 = ZEXT3264(*pauVar2);
          auVar103 = vsubps_avx(auVar84,auVar83);
          auVar186._0_4_ = auVar90._0_4_ * (float)local_c0;
          auVar186._4_4_ = auVar90._4_4_ * local_c0._4_4_;
          auVar186._8_4_ = auVar90._8_4_ * (float)uStack_b8;
          auVar186._12_4_ = auVar90._12_4_ * uStack_b8._4_4_;
          auVar186._16_4_ = auVar90._16_4_ * (float)uStack_b0;
          auVar186._20_4_ = auVar90._20_4_ * uStack_b0._4_4_;
          auVar186._24_4_ = auVar90._24_4_ * (float)uStack_a8;
          auVar186._28_4_ = 0;
          auVar165 = vfmadd231ps_fma(auVar186,local_740._0_32_,local_660);
          auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar127,local_640);
          auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),local_a0,auVar126);
          auVar55._4_4_ = fVar85 * local_c0._4_4_;
          auVar55._0_4_ = fVar121 * (float)local_c0;
          auVar55._8_4_ = fVar86 * (float)uStack_b8;
          auVar55._12_4_ = fVar210 * uStack_b8._4_4_;
          auVar55._16_4_ = fVar214 * (float)uStack_b0;
          auVar55._20_4_ = fVar87 * uStack_b0._4_4_;
          auVar55._24_4_ = fVar88 * (float)uStack_a8;
          auVar55._28_4_ = auVar127._28_4_;
          auVar164 = vfmadd231ps_fma(auVar55,auVar110,local_660);
          auVar164 = vfmadd231ps_fma(ZEXT1632(auVar164),auVar158,local_640);
          auVar164 = vfmadd231ps_fma(ZEXT1632(auVar164),auVar183,local_a0);
          auVar173._0_4_ = fVar141 * fVar141;
          auVar173._4_4_ = fVar140 * fVar140;
          auVar173._8_4_ = fVar116 * fVar116;
          auVar173._12_4_ = fVar117 * fVar117;
          auVar173._16_4_ = fVar118 * fVar118;
          auVar173._20_4_ = fVar119 * fVar119;
          auVar173._28_36_ = auVar202._28_36_;
          auVar173._24_4_ = fVar120 * fVar120;
          auVar5 = vfmadd231ps_fma(auVar173._0_32_,auVar195,auVar195);
          local_340 = ZEXT1632(auVar164);
          auVar133 = vmaxps_avx(ZEXT1632(auVar165),local_340);
          auVar200._0_4_ = auVar133._0_4_ * auVar133._0_4_ * auVar5._0_4_;
          auVar200._4_4_ = auVar133._4_4_ * auVar133._4_4_ * auVar5._4_4_;
          auVar200._8_4_ = auVar133._8_4_ * auVar133._8_4_ * auVar5._8_4_;
          auVar200._12_4_ = auVar133._12_4_ * auVar133._12_4_ * auVar5._12_4_;
          auVar200._16_4_ = auVar133._16_4_ * auVar133._16_4_ * 0.0;
          auVar200._20_4_ = auVar133._20_4_ * auVar133._20_4_ * 0.0;
          auVar200._24_4_ = auVar133._24_4_ * auVar133._24_4_ * 0.0;
          auVar200._28_4_ = 0;
          auVar56._4_4_ = auVar103._4_4_ * auVar103._4_4_;
          auVar56._0_4_ = auVar103._0_4_ * auVar103._0_4_;
          auVar56._8_4_ = auVar103._8_4_ * auVar103._8_4_;
          auVar56._12_4_ = auVar103._12_4_ * auVar103._12_4_;
          auVar56._16_4_ = auVar103._16_4_ * auVar103._16_4_;
          auVar56._20_4_ = auVar103._20_4_ * auVar103._20_4_;
          auVar56._24_4_ = auVar103._24_4_ * auVar103._24_4_;
          auVar56._28_4_ = auVar103._28_4_;
          auVar133 = vcmpps_avx(auVar56,auVar200,2);
          local_220 = (int)lVar97;
          auVar201._4_4_ = local_220;
          auVar201._0_4_ = local_220;
          auVar201._8_4_ = local_220;
          auVar201._12_4_ = local_220;
          auVar201._16_4_ = local_220;
          auVar201._20_4_ = local_220;
          auVar201._24_4_ = local_220;
          auVar201._28_4_ = local_220;
          auVar103 = vpor_avx2(auVar201,_DAT_01fe9900);
          auVar128 = vpcmpgtd_avx2(local_300,auVar103);
          auVar103 = auVar128 & auVar133;
          if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar103 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar103 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar103 >> 0x7f,0) == '\0') &&
                (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar103 >> 0xbf,0) == '\0') &&
              (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar103[0x1f]) {
            auVar202 = ZEXT3264(auVar199);
            auVar209 = ZEXT3264(local_7c0);
          }
          else {
            local_320 = vandps_avx(auVar128,auVar133);
            auVar57._4_4_ = fVar85 * (float)local_680._4_4_;
            auVar57._0_4_ = fVar121 * (float)local_680._0_4_;
            auVar57._8_4_ = fVar86 * fStack_678;
            auVar57._12_4_ = fVar210 * fStack_674;
            auVar57._16_4_ = fVar214 * fStack_670;
            auVar57._20_4_ = fVar87 * fStack_66c;
            auVar57._24_4_ = fVar88 * fStack_668;
            auVar57._28_4_ = auVar133._28_4_;
            auVar164 = vfmadd213ps_fma(auVar110,local_4c0,auVar57);
            auVar164 = vfmadd213ps_fma(auVar158,local_760,ZEXT1632(auVar164));
            auVar164 = vfmadd132ps_fma(auVar183,ZEXT1632(auVar164),local_5e0);
            auVar58._4_4_ = auVar90._4_4_ * (float)local_680._4_4_;
            auVar58._0_4_ = auVar90._0_4_ * (float)local_680._0_4_;
            auVar58._8_4_ = auVar90._8_4_ * fStack_678;
            auVar58._12_4_ = auVar90._12_4_ * fStack_674;
            auVar58._16_4_ = auVar90._16_4_ * fStack_670;
            auVar58._20_4_ = auVar90._20_4_ * fStack_66c;
            auVar58._24_4_ = auVar90._24_4_ * fStack_668;
            auVar58._28_4_ = auVar133._28_4_;
            auVar5 = vfmadd213ps_fma(local_740._0_32_,local_4c0,auVar58);
            auVar5 = vfmadd213ps_fma(auVar127,local_760,ZEXT1632(auVar5));
            auVar127 = *(undefined1 (*) [32])(lVar22 + 0x21ab4f4 + lVar97 * 4);
            auVar183 = *(undefined1 (*) [32])(lVar22 + 0x21ab978 + lVar97 * 4);
            auVar158 = *(undefined1 (*) [32])(lVar22 + 0x21abdfc + lVar97 * 4);
            pfVar1 = (float *)(lVar22 + 0x21ac280 + lVar97 * 4);
            fVar141 = *pfVar1;
            fVar140 = pfVar1[1];
            fVar116 = pfVar1[2];
            fVar117 = pfVar1[3];
            fVar118 = pfVar1[4];
            fVar119 = pfVar1[5];
            fVar120 = pfVar1[6];
            auVar59._4_4_ = fStack_49c * fVar140;
            auVar59._0_4_ = local_4a0 * fVar141;
            auVar59._8_4_ = fStack_498 * fVar116;
            auVar59._12_4_ = fStack_494 * fVar117;
            auVar59._16_4_ = fStack_490 * fVar118;
            auVar59._20_4_ = fStack_48c * fVar119;
            auVar59._24_4_ = fStack_488 * fVar120;
            auVar59._28_4_ = auVar112._28_4_;
            auVar60._4_4_ = fVar140 * local_480._4_4_;
            auVar60._0_4_ = fVar141 * (float)local_480;
            auVar60._8_4_ = fVar116 * (float)uStack_478;
            auVar60._12_4_ = fVar117 * uStack_478._4_4_;
            auVar60._16_4_ = fVar118 * (float)uStack_470;
            auVar60._20_4_ = fVar119 * uStack_470._4_4_;
            auVar60._24_4_ = fVar120 * (float)uStack_468;
            auVar60._28_4_ = *(undefined4 *)(*pauVar2 + 0x1c);
            auVar61._4_4_ = fVar140 * (float)local_680._4_4_;
            auVar61._0_4_ = fVar141 * (float)local_680._0_4_;
            auVar61._8_4_ = fVar116 * fStack_678;
            auVar61._12_4_ = fVar117 * fStack_674;
            auVar61._16_4_ = fVar118 * fStack_670;
            auVar61._20_4_ = fVar119 * fStack_66c;
            auVar61._24_4_ = fVar120 * fStack_668;
            auVar61._28_4_ = pfVar1[7];
            auVar6 = vfmadd231ps_fma(auVar59,auVar158,local_700);
            auVar7 = vfmadd231ps_fma(auVar60,auVar158,local_5c0);
            auVar10 = vfmadd231ps_fma(auVar61,local_4c0,auVar158);
            auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar183,auVar199);
            auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar183,local_4e0);
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),local_760,auVar183);
            auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar127,local_7c0);
            auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar127,local_500);
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar127,local_5e0);
            pfVar1 = (float *)(lVar22 + 0x21ae6a0 + lVar97 * 4);
            fVar141 = *pfVar1;
            fVar140 = pfVar1[1];
            fVar116 = pfVar1[2];
            fVar117 = pfVar1[3];
            fVar118 = pfVar1[4];
            fVar119 = pfVar1[5];
            fVar120 = pfVar1[6];
            auVar62._4_4_ = fStack_49c * fVar140;
            auVar62._0_4_ = local_4a0 * fVar141;
            auVar62._8_4_ = fStack_498 * fVar116;
            auVar62._12_4_ = fStack_494 * fVar117;
            auVar62._16_4_ = fStack_490 * fVar118;
            auVar62._20_4_ = fStack_48c * fVar119;
            auVar62._24_4_ = fStack_488 * fVar120;
            auVar62._28_4_ = fStack_484;
            auVar63._4_4_ = local_480._4_4_ * fVar140;
            auVar63._0_4_ = (float)local_480 * fVar141;
            auVar63._8_4_ = (float)uStack_478 * fVar116;
            auVar63._12_4_ = uStack_478._4_4_ * fVar117;
            auVar63._16_4_ = (float)uStack_470 * fVar118;
            auVar63._20_4_ = uStack_470._4_4_ * fVar119;
            auVar63._24_4_ = (float)uStack_468 * fVar120;
            auVar63._28_4_ = local_760._28_4_;
            auVar64._4_4_ = fVar140 * (float)local_680._4_4_;
            auVar64._0_4_ = fVar141 * (float)local_680._0_4_;
            auVar64._8_4_ = fVar116 * fStack_678;
            auVar64._12_4_ = fVar117 * fStack_674;
            auVar64._16_4_ = fVar118 * fStack_670;
            auVar64._20_4_ = fVar119 * fStack_66c;
            auVar64._24_4_ = fVar120 * fStack_668;
            auVar64._28_4_ = pfVar1[7];
            auVar127 = *(undefined1 (*) [32])(lVar22 + 0x21ae21c + lVar97 * 4);
            auVar11 = vfmadd231ps_fma(auVar62,auVar127,local_700);
            auVar101 = vfmadd231ps_fma(auVar63,auVar127,local_5c0);
            auVar142 = vfmadd231ps_fma(auVar64,auVar127,local_4c0);
            auVar127 = *(undefined1 (*) [32])(lVar22 + 0x21add98 + lVar97 * 4);
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar127,auVar199);
            auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar127,local_4e0);
            auVar142 = vfmadd231ps_fma(ZEXT1632(auVar142),auVar127,local_760);
            auVar127 = *(undefined1 (*) [32])(lVar22 + 0x21ad914 + lVar97 * 4);
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar127,local_7c0);
            auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar127,local_500);
            auVar142 = vfmadd231ps_fma(ZEXT1632(auVar142),local_5e0,auVar127);
            auVar127 = vandps_avx(ZEXT1632(auVar6),local_140);
            auVar183 = vandps_avx(ZEXT1632(auVar7),local_140);
            auVar183 = vmaxps_avx(auVar127,auVar183);
            auVar127 = vandps_avx(ZEXT1632(auVar10),local_140);
            auVar127 = vmaxps_avx(auVar183,auVar127);
            auVar89._4_4_ = fStack_35c;
            auVar89._0_4_ = local_360;
            auVar89._8_4_ = fStack_358;
            auVar89._12_4_ = fStack_354;
            auVar89._16_4_ = fStack_350;
            auVar89._20_4_ = fStack_34c;
            auVar89._24_4_ = fStack_348;
            auVar89._28_4_ = fStack_344;
            auVar127 = vcmpps_avx(auVar127,auVar89,1);
            auVar158 = vblendvps_avx(ZEXT1632(auVar6),auVar195,auVar127);
            auVar110 = vblendvps_avx(ZEXT1632(auVar7),auVar112,auVar127);
            auVar127 = vandps_avx(ZEXT1632(auVar11),local_140);
            auVar183 = vandps_avx(ZEXT1632(auVar101),local_140);
            auVar183 = vmaxps_avx(auVar127,auVar183);
            auVar127 = vandps_avx(local_140,ZEXT1632(auVar142));
            auVar127 = vmaxps_avx(auVar183,auVar127);
            auVar183 = vcmpps_avx(auVar127,auVar89,1);
            auVar127 = vblendvps_avx(ZEXT1632(auVar11),auVar195,auVar183);
            auVar183 = vblendvps_avx(ZEXT1632(auVar101),auVar112,auVar183);
            auVar5 = vfmadd213ps_fma(auVar126,local_5e0,ZEXT1632(auVar5));
            auVar6 = vfmadd213ps_fma(auVar158,auVar158,ZEXT832(0) << 0x20);
            auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar110,auVar110);
            auVar126 = vrsqrtps_avx(ZEXT1632(auVar6));
            fVar141 = auVar126._0_4_;
            fVar140 = auVar126._4_4_;
            fVar116 = auVar126._8_4_;
            fVar117 = auVar126._12_4_;
            fVar118 = auVar126._16_4_;
            fVar119 = auVar126._20_4_;
            fVar120 = auVar126._24_4_;
            auVar65._4_4_ = fVar140 * fVar140 * fVar140 * auVar6._4_4_ * -0.5;
            auVar65._0_4_ = fVar141 * fVar141 * fVar141 * auVar6._0_4_ * -0.5;
            auVar65._8_4_ = fVar116 * fVar116 * fVar116 * auVar6._8_4_ * -0.5;
            auVar65._12_4_ = fVar117 * fVar117 * fVar117 * auVar6._12_4_ * -0.5;
            auVar65._16_4_ = fVar118 * fVar118 * fVar118 * -0.0;
            auVar65._20_4_ = fVar119 * fVar119 * fVar119 * -0.0;
            auVar65._24_4_ = fVar120 * fVar120 * fVar120 * -0.0;
            auVar65._28_4_ = 0;
            auVar221._8_4_ = 0x3fc00000;
            auVar221._0_8_ = 0x3fc000003fc00000;
            auVar221._12_4_ = 0x3fc00000;
            auVar221._16_4_ = 0x3fc00000;
            auVar221._20_4_ = 0x3fc00000;
            auVar221._24_4_ = 0x3fc00000;
            auVar221._28_4_ = 0x3fc00000;
            auVar6 = vfmadd231ps_fma(auVar65,auVar221,auVar126);
            fVar141 = auVar6._0_4_;
            fVar140 = auVar6._4_4_;
            auVar66._4_4_ = auVar110._4_4_ * fVar140;
            auVar66._0_4_ = auVar110._0_4_ * fVar141;
            fVar116 = auVar6._8_4_;
            auVar66._8_4_ = auVar110._8_4_ * fVar116;
            fVar117 = auVar6._12_4_;
            auVar66._12_4_ = auVar110._12_4_ * fVar117;
            auVar66._16_4_ = auVar110._16_4_ * 0.0;
            auVar66._20_4_ = auVar110._20_4_ * 0.0;
            auVar66._24_4_ = auVar110._24_4_ * 0.0;
            auVar66._28_4_ = auVar110._28_4_;
            auVar67._4_4_ = fVar140 * -auVar158._4_4_;
            auVar67._0_4_ = fVar141 * -auVar158._0_4_;
            auVar67._8_4_ = fVar116 * -auVar158._8_4_;
            auVar67._12_4_ = fVar117 * -auVar158._12_4_;
            auVar67._16_4_ = -auVar158._16_4_ * 0.0;
            auVar67._20_4_ = -auVar158._20_4_ * 0.0;
            auVar67._24_4_ = -auVar158._24_4_ * 0.0;
            auVar67._28_4_ = auVar126._28_4_;
            auVar6 = vfmadd213ps_fma(auVar127,auVar127,ZEXT832(0) << 0x20);
            auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar183,auVar183);
            auVar126 = vrsqrtps_avx(ZEXT1632(auVar6));
            auVar68._28_4_ = local_5c0._28_4_;
            auVar68._0_28_ =
                 ZEXT1628(CONCAT412(fVar117 * 0.0,
                                    CONCAT48(fVar116 * 0.0,CONCAT44(fVar140 * 0.0,fVar141 * 0.0))));
            fVar141 = auVar126._0_4_;
            fVar140 = auVar126._4_4_;
            fVar116 = auVar126._8_4_;
            fVar117 = auVar126._12_4_;
            fVar118 = auVar126._16_4_;
            fVar119 = auVar126._20_4_;
            fVar120 = auVar126._24_4_;
            auVar69._4_4_ = fVar140 * fVar140 * fVar140 * auVar6._4_4_ * -0.5;
            auVar69._0_4_ = fVar141 * fVar141 * fVar141 * auVar6._0_4_ * -0.5;
            auVar69._8_4_ = fVar116 * fVar116 * fVar116 * auVar6._8_4_ * -0.5;
            auVar69._12_4_ = fVar117 * fVar117 * fVar117 * auVar6._12_4_ * -0.5;
            auVar69._16_4_ = fVar118 * fVar118 * fVar118 * -0.0;
            auVar69._20_4_ = fVar119 * fVar119 * fVar119 * -0.0;
            auVar69._24_4_ = fVar120 * fVar120 * fVar120 * -0.0;
            auVar69._28_4_ = 0;
            auVar6 = vfmadd231ps_fma(auVar69,auVar221,auVar126);
            fVar141 = auVar6._0_4_;
            fVar140 = auVar6._4_4_;
            auVar70._4_4_ = auVar183._4_4_ * fVar140;
            auVar70._0_4_ = auVar183._0_4_ * fVar141;
            fVar116 = auVar6._8_4_;
            auVar70._8_4_ = auVar183._8_4_ * fVar116;
            fVar117 = auVar6._12_4_;
            auVar70._12_4_ = auVar183._12_4_ * fVar117;
            auVar70._16_4_ = auVar183._16_4_ * 0.0;
            auVar70._20_4_ = auVar183._20_4_ * 0.0;
            auVar70._24_4_ = auVar183._24_4_ * 0.0;
            auVar70._28_4_ = 0;
            auVar71._4_4_ = fVar140 * -auVar127._4_4_;
            auVar71._0_4_ = fVar141 * -auVar127._0_4_;
            auVar71._8_4_ = fVar116 * -auVar127._8_4_;
            auVar71._12_4_ = fVar117 * -auVar127._12_4_;
            auVar71._16_4_ = -auVar127._16_4_ * 0.0;
            auVar71._20_4_ = -auVar127._20_4_ * 0.0;
            auVar71._24_4_ = -auVar127._24_4_ * 0.0;
            auVar71._28_4_ = auVar126._28_4_;
            auVar72._28_4_ = 0xbf000000;
            auVar72._0_28_ =
                 ZEXT1628(CONCAT412(fVar117 * 0.0,
                                    CONCAT48(fVar116 * 0.0,CONCAT44(fVar140 * 0.0,fVar141 * 0.0))));
            auVar6 = vfmadd213ps_fma(auVar66,ZEXT1632(auVar165),local_2e0);
            auVar126 = ZEXT1632(auVar165);
            auVar7 = vfmadd213ps_fma(auVar67,auVar126,local_2c0);
            auVar10 = vfmadd213ps_fma(auVar68,auVar126,ZEXT1632(auVar5));
            auVar142 = vfnmadd213ps_fma(auVar66,auVar126,local_2e0);
            auVar11 = vfmadd213ps_fma(auVar70,local_340,local_620);
            auVar102 = vfnmadd213ps_fma(auVar67,auVar126,local_2c0);
            auVar101 = vfmadd213ps_fma(auVar71,local_340,local_600);
            auVar155 = ZEXT1632(auVar165);
            auVar165 = vfnmadd231ps_fma(ZEXT1632(auVar5),auVar155,auVar68);
            auVar5 = vfmadd213ps_fma(auVar72,local_340,ZEXT1632(auVar164));
            auVar23 = vfnmadd213ps_fma(auVar70,local_340,local_620);
            auVar123 = vfnmadd213ps_fma(auVar71,local_340,local_600);
            auVar164 = vfnmadd231ps_fma(ZEXT1632(auVar164),local_340,auVar72);
            local_6e0 = ZEXT1632(auVar164);
            auVar126 = vsubps_avx(ZEXT1632(auVar101),ZEXT1632(auVar102));
            auVar127 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar165));
            auVar187._0_4_ = auVar126._0_4_ * auVar165._0_4_;
            auVar187._4_4_ = auVar126._4_4_ * auVar165._4_4_;
            auVar187._8_4_ = auVar126._8_4_ * auVar165._8_4_;
            auVar187._12_4_ = auVar126._12_4_ * auVar165._12_4_;
            auVar187._16_4_ = auVar126._16_4_ * 0.0;
            auVar187._20_4_ = auVar126._20_4_ * 0.0;
            auVar187._24_4_ = auVar126._24_4_ * 0.0;
            auVar187._28_4_ = 0;
            auVar164 = vfmsub231ps_fma(auVar187,ZEXT1632(auVar102),auVar127);
            auVar73._4_4_ = auVar142._4_4_ * auVar127._4_4_;
            auVar73._0_4_ = auVar142._0_4_ * auVar127._0_4_;
            auVar73._8_4_ = auVar142._8_4_ * auVar127._8_4_;
            auVar73._12_4_ = auVar142._12_4_ * auVar127._12_4_;
            auVar73._16_4_ = auVar127._16_4_ * 0.0;
            auVar73._20_4_ = auVar127._20_4_ * 0.0;
            auVar73._24_4_ = auVar127._24_4_ * 0.0;
            auVar73._28_4_ = auVar127._28_4_;
            auVar133 = ZEXT1632(auVar142);
            auVar127 = vsubps_avx(ZEXT1632(auVar11),auVar133);
            auVar112 = ZEXT1632(auVar165);
            auVar165 = vfmsub231ps_fma(auVar73,auVar112,auVar127);
            auVar74._4_4_ = auVar102._4_4_ * auVar127._4_4_;
            auVar74._0_4_ = auVar102._0_4_ * auVar127._0_4_;
            auVar74._8_4_ = auVar102._8_4_ * auVar127._8_4_;
            auVar74._12_4_ = auVar102._12_4_ * auVar127._12_4_;
            auVar74._16_4_ = auVar127._16_4_ * 0.0;
            auVar74._20_4_ = auVar127._20_4_ * 0.0;
            auVar74._24_4_ = auVar127._24_4_ * 0.0;
            auVar74._28_4_ = auVar127._28_4_;
            auVar142 = vfmsub231ps_fma(auVar74,auVar133,auVar126);
            auVar165 = vfmadd231ps_fma(ZEXT1632(auVar142),ZEXT832(0) << 0x20,ZEXT1632(auVar165));
            auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),ZEXT832(0) << 0x20,ZEXT1632(auVar164));
            auVar103 = vcmpps_avx(ZEXT1632(auVar165),ZEXT832(0) << 0x20,2);
            auVar126 = vblendvps_avx(ZEXT1632(auVar23),ZEXT1632(auVar6),auVar103);
            local_740._0_32_ = vblendvps_avx(ZEXT1632(auVar123),ZEXT1632(auVar7),auVar103);
            auVar127 = vblendvps_avx(local_6e0,ZEXT1632(auVar10),auVar103);
            auVar183 = vblendvps_avx(auVar133,ZEXT1632(auVar11),auVar103);
            auVar158 = vblendvps_avx(ZEXT1632(auVar102),ZEXT1632(auVar101),auVar103);
            auVar110 = vblendvps_avx(auVar112,ZEXT1632(auVar5),auVar103);
            auVar133 = vblendvps_avx(ZEXT1632(auVar11),auVar133,auVar103);
            auVar195 = vblendvps_avx(ZEXT1632(auVar101),ZEXT1632(auVar102),auVar103);
            auVar165 = vpackssdw_avx(local_320._0_16_,local_320._16_16_);
            auVar112 = vblendvps_avx(ZEXT1632(auVar5),auVar112,auVar103);
            auVar133 = vsubps_avx(auVar133,auVar126);
            auVar195 = vsubps_avx(auVar195,local_740._0_32_);
            auVar128 = vsubps_avx(auVar112,auVar127);
            auVar199 = vsubps_avx(auVar126,auVar183);
            auVar21 = vsubps_avx(local_740._0_32_,auVar158);
            auVar154 = vsubps_avx(auVar127,auVar110);
            auVar180._0_4_ = auVar128._0_4_ * auVar126._0_4_;
            auVar180._4_4_ = auVar128._4_4_ * auVar126._4_4_;
            auVar180._8_4_ = auVar128._8_4_ * auVar126._8_4_;
            auVar180._12_4_ = auVar128._12_4_ * auVar126._12_4_;
            auVar180._16_4_ = auVar128._16_4_ * auVar126._16_4_;
            auVar180._20_4_ = auVar128._20_4_ * auVar126._20_4_;
            auVar180._24_4_ = auVar128._24_4_ * auVar126._24_4_;
            auVar180._28_4_ = 0;
            auVar164 = vfmsub231ps_fma(auVar180,auVar127,auVar133);
            auVar75._4_4_ = auVar133._4_4_ * local_740._4_4_;
            auVar75._0_4_ = auVar133._0_4_ * local_740._0_4_;
            auVar75._8_4_ = auVar133._8_4_ * local_740._8_4_;
            auVar75._12_4_ = auVar133._12_4_ * local_740._12_4_;
            auVar75._16_4_ = auVar133._16_4_ * local_740._16_4_;
            auVar75._20_4_ = auVar133._20_4_ * local_740._20_4_;
            auVar75._24_4_ = auVar133._24_4_ * local_740._24_4_;
            auVar75._28_4_ = auVar112._28_4_;
            auVar5 = vfmsub231ps_fma(auVar75,auVar126,auVar195);
            auVar213 = ZEXT864(0) << 0x20;
            auVar164 = vfmadd231ps_fma(ZEXT1632(auVar5),ZEXT832(0) << 0x20,ZEXT1632(auVar164));
            auVar181._0_4_ = auVar195._0_4_ * auVar127._0_4_;
            auVar181._4_4_ = auVar195._4_4_ * auVar127._4_4_;
            auVar181._8_4_ = auVar195._8_4_ * auVar127._8_4_;
            auVar181._12_4_ = auVar195._12_4_ * auVar127._12_4_;
            auVar181._16_4_ = auVar195._16_4_ * auVar127._16_4_;
            auVar181._20_4_ = auVar195._20_4_ * auVar127._20_4_;
            auVar181._24_4_ = auVar195._24_4_ * auVar127._24_4_;
            auVar181._28_4_ = 0;
            auVar5 = vfmsub231ps_fma(auVar181,local_740._0_32_,auVar128);
            auVar5 = vfmadd231ps_fma(ZEXT1632(auVar164),ZEXT832(0) << 0x20,ZEXT1632(auVar5));
            auVar182._0_4_ = auVar154._0_4_ * auVar183._0_4_;
            auVar182._4_4_ = auVar154._4_4_ * auVar183._4_4_;
            auVar182._8_4_ = auVar154._8_4_ * auVar183._8_4_;
            auVar182._12_4_ = auVar154._12_4_ * auVar183._12_4_;
            auVar182._16_4_ = auVar154._16_4_ * auVar183._16_4_;
            auVar182._20_4_ = auVar154._20_4_ * auVar183._20_4_;
            auVar182._24_4_ = auVar154._24_4_ * auVar183._24_4_;
            auVar182._28_4_ = 0;
            auVar164 = vfmsub231ps_fma(auVar182,auVar199,auVar110);
            auVar76._4_4_ = auVar21._4_4_ * auVar110._4_4_;
            auVar76._0_4_ = auVar21._0_4_ * auVar110._0_4_;
            auVar76._8_4_ = auVar21._8_4_ * auVar110._8_4_;
            auVar76._12_4_ = auVar21._12_4_ * auVar110._12_4_;
            auVar76._16_4_ = auVar21._16_4_ * auVar110._16_4_;
            auVar76._20_4_ = auVar21._20_4_ * auVar110._20_4_;
            auVar76._24_4_ = auVar21._24_4_ * auVar110._24_4_;
            auVar76._28_4_ = auVar110._28_4_;
            auVar6 = vfmsub231ps_fma(auVar76,auVar158,auVar154);
            auVar77._4_4_ = auVar199._4_4_ * auVar158._4_4_;
            auVar77._0_4_ = auVar199._0_4_ * auVar158._0_4_;
            auVar77._8_4_ = auVar199._8_4_ * auVar158._8_4_;
            auVar77._12_4_ = auVar199._12_4_ * auVar158._12_4_;
            auVar77._16_4_ = auVar199._16_4_ * auVar158._16_4_;
            auVar77._20_4_ = auVar199._20_4_ * auVar158._20_4_;
            auVar77._24_4_ = auVar199._24_4_ * auVar158._24_4_;
            auVar77._28_4_ = auVar158._28_4_;
            auVar7 = vfmsub231ps_fma(auVar77,auVar21,auVar183);
            auVar164 = vfmadd231ps_fma(ZEXT1632(auVar7),ZEXT832(0) << 0x20,ZEXT1632(auVar164));
            auVar6 = vfmadd231ps_fma(ZEXT1632(auVar164),ZEXT832(0) << 0x20,ZEXT1632(auVar6));
            auVar183 = vmaxps_avx(ZEXT1632(auVar5),ZEXT1632(auVar6));
            auVar183 = vcmpps_avx(auVar183,ZEXT832(0) << 0x20,2);
            auVar164 = vpackssdw_avx(auVar183._0_16_,auVar183._16_16_);
            auVar165 = vpand_avx(auVar164,auVar165);
            auVar183 = vpmovsxwd_avx2(auVar165);
            if ((((((((auVar183 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar183 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar183 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar183 >> 0x7f,0) == '\0') &&
                  (auVar183 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar183 >> 0xbf,0) == '\0') &&
                (auVar183 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar183[0x1f]) {
LAB_018d7ae7:
              auVar169._8_8_ = uStack_558;
              auVar169._0_8_ = local_560;
              auVar169._16_8_ = uStack_550;
              auVar169._24_8_ = uStack_548;
            }
            else {
              auVar78._4_4_ = auVar195._4_4_ * auVar154._4_4_;
              auVar78._0_4_ = auVar195._0_4_ * auVar154._0_4_;
              auVar78._8_4_ = auVar195._8_4_ * auVar154._8_4_;
              auVar78._12_4_ = auVar195._12_4_ * auVar154._12_4_;
              auVar78._16_4_ = auVar195._16_4_ * auVar154._16_4_;
              auVar78._20_4_ = auVar195._20_4_ * auVar154._20_4_;
              auVar78._24_4_ = auVar195._24_4_ * auVar154._24_4_;
              auVar78._28_4_ = auVar183._28_4_;
              auVar11 = vfmsub231ps_fma(auVar78,auVar21,auVar128);
              auVar188._0_4_ = auVar199._0_4_ * auVar128._0_4_;
              auVar188._4_4_ = auVar199._4_4_ * auVar128._4_4_;
              auVar188._8_4_ = auVar199._8_4_ * auVar128._8_4_;
              auVar188._12_4_ = auVar199._12_4_ * auVar128._12_4_;
              auVar188._16_4_ = auVar199._16_4_ * auVar128._16_4_;
              auVar188._20_4_ = auVar199._20_4_ * auVar128._20_4_;
              auVar188._24_4_ = auVar199._24_4_ * auVar128._24_4_;
              auVar188._28_4_ = 0;
              auVar10 = vfmsub231ps_fma(auVar188,auVar133,auVar154);
              auVar79._4_4_ = auVar133._4_4_ * auVar21._4_4_;
              auVar79._0_4_ = auVar133._0_4_ * auVar21._0_4_;
              auVar79._8_4_ = auVar133._8_4_ * auVar21._8_4_;
              auVar79._12_4_ = auVar133._12_4_ * auVar21._12_4_;
              auVar79._16_4_ = auVar133._16_4_ * auVar21._16_4_;
              auVar79._20_4_ = auVar133._20_4_ * auVar21._20_4_;
              auVar79._24_4_ = auVar133._24_4_ * auVar21._24_4_;
              auVar79._28_4_ = auVar21._28_4_;
              auVar101 = vfmsub231ps_fma(auVar79,auVar199,auVar195);
              auVar164 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar10),ZEXT1632(auVar101));
              auVar7 = vfmadd231ps_fma(ZEXT1632(auVar164),ZEXT1632(auVar11),ZEXT832(0) << 0x20);
              auVar183 = vrcpps_avx(ZEXT1632(auVar7));
              auVar212._8_4_ = 0x3f800000;
              auVar212._0_8_ = 0x3f8000003f800000;
              auVar212._12_4_ = 0x3f800000;
              auVar212._16_4_ = 0x3f800000;
              auVar212._20_4_ = 0x3f800000;
              auVar212._24_4_ = 0x3f800000;
              auVar212._28_4_ = 0x3f800000;
              auVar213 = ZEXT3264(auVar212);
              auVar164 = vfnmadd213ps_fma(auVar183,ZEXT1632(auVar7),auVar212);
              auVar164 = vfmadd132ps_fma(ZEXT1632(auVar164),auVar183,auVar183);
              auVar80._4_4_ = auVar101._4_4_ * auVar127._4_4_;
              auVar80._0_4_ = auVar101._0_4_ * auVar127._0_4_;
              auVar80._8_4_ = auVar101._8_4_ * auVar127._8_4_;
              auVar80._12_4_ = auVar101._12_4_ * auVar127._12_4_;
              auVar80._16_4_ = auVar127._16_4_ * 0.0;
              auVar80._20_4_ = auVar127._20_4_ * 0.0;
              auVar80._24_4_ = auVar127._24_4_ * 0.0;
              auVar80._28_4_ = auVar127._28_4_;
              auVar10 = vfmadd231ps_fma(auVar80,ZEXT1632(auVar10),local_740._0_32_);
              auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT1632(auVar11),auVar126);
              fVar141 = auVar164._0_4_;
              fVar140 = auVar164._4_4_;
              fVar116 = auVar164._8_4_;
              fVar117 = auVar164._12_4_;
              auVar183 = ZEXT1632(CONCAT412(fVar117 * auVar10._12_4_,
                                            CONCAT48(fVar116 * auVar10._8_4_,
                                                     CONCAT44(fVar140 * auVar10._4_4_,
                                                              fVar141 * auVar10._0_4_))));
              uVar99 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar168._4_4_ = uVar99;
              auVar168._0_4_ = uVar99;
              auVar168._8_4_ = uVar99;
              auVar168._12_4_ = uVar99;
              auVar168._16_4_ = uVar99;
              auVar168._20_4_ = uVar99;
              auVar168._24_4_ = uVar99;
              auVar168._28_4_ = uVar99;
              auVar126 = vcmpps_avx(local_380,auVar183,2);
              auVar127 = vcmpps_avx(auVar183,auVar168,2);
              auVar126 = vandps_avx(auVar127,auVar126);
              auVar164 = vpackssdw_avx(auVar126._0_16_,auVar126._16_16_);
              auVar165 = vpand_avx(auVar165,auVar164);
              auVar126 = vpmovsxwd_avx2(auVar165);
              if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar126 >> 0x7f,0) == '\0') &&
                    (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar126 >> 0xbf,0) == '\0') &&
                  (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar126[0x1f]) goto LAB_018d7ae7;
              auVar126 = vcmpps_avx(ZEXT1632(auVar7),ZEXT832(0) << 0x20,4);
              auVar164 = vpackssdw_avx(auVar126._0_16_,auVar126._16_16_);
              auVar165 = vpand_avx(auVar165,auVar164);
              auVar126 = vpmovsxwd_avx2(auVar165);
              auVar169._8_8_ = uStack_558;
              auVar169._0_8_ = local_560;
              auVar169._16_8_ = uStack_550;
              auVar169._24_8_ = uStack_548;
              if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar126 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar126 >> 0x7f,0) != '\0') ||
                    (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar126 >> 0xbf,0) != '\0') ||
                  (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar126[0x1f] < '\0') {
                auVar158 = ZEXT1632(CONCAT412(fVar117 * auVar5._12_4_,
                                              CONCAT48(fVar116 * auVar5._8_4_,
                                                       CONCAT44(fVar140 * auVar5._4_4_,
                                                                fVar141 * auVar5._0_4_))));
                auVar81._28_4_ = SUB84(uStack_548,4);
                auVar81._0_28_ =
                     ZEXT1628(CONCAT412(fVar117 * auVar6._12_4_,
                                        CONCAT48(fVar116 * auVar6._8_4_,
                                                 CONCAT44(fVar140 * auVar6._4_4_,
                                                          fVar141 * auVar6._0_4_))));
                auVar196._8_4_ = 0x3f800000;
                auVar196._0_8_ = 0x3f8000003f800000;
                auVar196._12_4_ = 0x3f800000;
                auVar196._16_4_ = 0x3f800000;
                auVar196._20_4_ = 0x3f800000;
                auVar196._24_4_ = 0x3f800000;
                auVar196._28_4_ = 0x3f800000;
                auVar127 = vsubps_avx(auVar196,auVar158);
                local_e0 = vblendvps_avx(auVar127,auVar158,auVar103);
                auVar127 = vsubps_avx(auVar196,auVar81);
                local_3c0 = vblendvps_avx(auVar127,auVar81,auVar103);
                auVar169 = auVar126;
                local_540 = auVar183;
              }
            }
            auVar209 = ZEXT3264(local_7c0);
            auVar202 = ZEXT3264(local_6c0);
            if ((((((((auVar169 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar169 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar169 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar169 >> 0x7f,0) != '\0') ||
                  (auVar169 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar169 >> 0xbf,0) != '\0') ||
                (auVar169 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar169[0x1f] < '\0') {
              auVar126 = vsubps_avx(local_340,auVar155);
              auVar165 = vfmadd213ps_fma(auVar126,local_e0,auVar155);
              fVar141 = *(float *)((long)local_7c8->ray_space + k * 4 + -0x10);
              auVar82._4_4_ = (auVar165._4_4_ + auVar165._4_4_) * fVar141;
              auVar82._0_4_ = (auVar165._0_4_ + auVar165._0_4_) * fVar141;
              auVar82._8_4_ = (auVar165._8_4_ + auVar165._8_4_) * fVar141;
              auVar82._12_4_ = (auVar165._12_4_ + auVar165._12_4_) * fVar141;
              auVar82._16_4_ = fVar141 * 0.0;
              auVar82._20_4_ = fVar141 * 0.0;
              auVar82._24_4_ = fVar141 * 0.0;
              auVar82._28_4_ = fVar141;
              auVar126 = vcmpps_avx(local_540,auVar82,6);
              auVar127 = auVar169 & auVar126;
              if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar127 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar127 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar127 >> 0x7f,0) != '\0') ||
                    (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar127 >> 0xbf,0) != '\0') ||
                  (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar127[0x1f] < '\0') {
                auVar136._8_4_ = 0xbf800000;
                auVar136._0_8_ = 0xbf800000bf800000;
                auVar136._12_4_ = 0xbf800000;
                auVar136._16_4_ = 0xbf800000;
                auVar136._20_4_ = 0xbf800000;
                auVar136._24_4_ = 0xbf800000;
                auVar136._28_4_ = 0xbf800000;
                auVar159._8_4_ = 0x40000000;
                auVar159._0_8_ = 0x4000000040000000;
                auVar159._12_4_ = 0x40000000;
                auVar159._16_4_ = 0x40000000;
                auVar159._20_4_ = 0x40000000;
                auVar159._24_4_ = 0x40000000;
                auVar159._28_4_ = 0x40000000;
                auVar165 = vfmadd213ps_fma(local_3c0,auVar159,auVar136);
                local_280 = local_e0;
                local_3c0 = ZEXT1632(auVar165);
                auVar127 = local_3c0;
                local_260 = ZEXT1632(auVar165);
                local_240 = local_540;
                local_21c = iVar15;
                local_210 = local_7f0;
                uStack_208 = uStack_7e8;
                local_200 = local_810;
                uStack_1f8 = uStack_808;
                local_1f0 = local_820;
                uStack_1e8 = uStack_818;
                local_1e0 = local_800;
                uStack_1d8 = uStack_7f8;
                pGVar98 = (context->scene->geometries).items[uVar13].ptr;
                local_3c0 = auVar127;
                if ((pGVar98->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  local_5a0 = vandps_avx(auVar126,auVar169);
                  fVar141 = (float)local_220;
                  local_1a0[0] = (fVar141 + local_e0._0_4_ + 0.0) * local_100;
                  local_1a0[1] = (fVar141 + local_e0._4_4_ + 1.0) * fStack_fc;
                  local_1a0[2] = (fVar141 + local_e0._8_4_ + 2.0) * fStack_f8;
                  local_1a0[3] = (fVar141 + local_e0._12_4_ + 3.0) * fStack_f4;
                  fStack_190 = (fVar141 + local_e0._16_4_ + 4.0) * fStack_f0;
                  fStack_18c = (fVar141 + local_e0._20_4_ + 5.0) * fStack_ec;
                  fStack_188 = (fVar141 + local_e0._24_4_ + 6.0) * fStack_e8;
                  fStack_184 = fVar141 + local_e0._28_4_ + 7.0;
                  local_3c0._0_8_ = auVar165._0_8_;
                  local_3c0._8_8_ = auVar165._8_8_;
                  local_180 = local_3c0._0_8_;
                  uStack_178 = local_3c0._8_8_;
                  uStack_170 = 0;
                  uStack_168 = 0;
                  local_160 = local_540;
                  auVar137._8_4_ = 0x7f800000;
                  auVar137._0_8_ = 0x7f8000007f800000;
                  auVar137._12_4_ = 0x7f800000;
                  auVar137._16_4_ = 0x7f800000;
                  auVar137._20_4_ = 0x7f800000;
                  auVar137._24_4_ = 0x7f800000;
                  auVar137._28_4_ = 0x7f800000;
                  auVar126 = vblendvps_avx(auVar137,local_540,local_5a0);
                  auVar127 = vshufps_avx(auVar126,auVar126,0xb1);
                  auVar127 = vminps_avx(auVar126,auVar127);
                  auVar183 = vshufpd_avx(auVar127,auVar127,5);
                  auVar127 = vminps_avx(auVar127,auVar183);
                  auVar183 = vpermpd_avx2(auVar127,0x4e);
                  auVar127 = vminps_avx(auVar127,auVar183);
                  auVar127 = vcmpps_avx(auVar126,auVar127,0);
                  auVar183 = local_5a0 & auVar127;
                  auVar126 = local_5a0;
                  if ((((((((auVar183 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar183 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar183 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar183 >> 0x7f,0) != '\0') ||
                        (auVar183 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar183 >> 0xbf,0) != '\0') ||
                      (auVar183 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar183[0x1f] < '\0') {
                    auVar126 = vandps_avx(auVar127,local_5a0);
                  }
                  uVar92 = vmovmskps_avx(auVar126);
                  uVar94 = 0;
                  for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
                    uVar94 = uVar94 + 1;
                  }
                  uVar93 = (ulong)uVar94;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar98->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar141 = local_1a0[uVar93];
                    uVar99 = *(undefined4 *)((long)&local_180 + uVar93 * 4);
                    fVar116 = 1.0 - fVar141;
                    fVar140 = fVar116 * fVar116 * -3.0;
                    auVar165 = vfmadd231ss_fma(ZEXT416((uint)(fVar116 * fVar116)),
                                               ZEXT416((uint)(fVar141 * fVar116)),
                                               ZEXT416(0xc0000000));
                    auVar164 = vfmsub132ss_fma(ZEXT416((uint)(fVar141 * fVar116)),
                                               ZEXT416((uint)(fVar141 * fVar141)),
                                               ZEXT416(0x40000000));
                    fVar116 = auVar165._0_4_ * 3.0;
                    fVar117 = auVar164._0_4_ * 3.0;
                    fVar118 = fVar141 * fVar141 * 3.0;
                    auVar175._0_4_ = fVar118 * fVar115;
                    auVar175._4_4_ = fVar118 * fVar197;
                    auVar175._8_4_ = fVar118 * fVar203;
                    auVar175._12_4_ = fVar118 * fVar204;
                    auVar148._4_4_ = fVar117;
                    auVar148._0_4_ = fVar117;
                    auVar148._8_4_ = fVar117;
                    auVar148._12_4_ = fVar117;
                    auVar165 = vfmadd132ps_fma(auVar148,auVar175,auVar8);
                    auVar163._4_4_ = fVar116;
                    auVar163._0_4_ = fVar116;
                    auVar163._8_4_ = fVar116;
                    auVar163._12_4_ = fVar116;
                    auVar165 = vfmadd132ps_fma(auVar163,auVar165,auVar122);
                    auVar149._4_4_ = fVar140;
                    auVar149._0_4_ = fVar140;
                    auVar149._8_4_ = fVar140;
                    auVar149._12_4_ = fVar140;
                    auVar165 = vfmadd132ps_fma(auVar149,auVar165,auVar9);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar93 * 4);
                    *(int *)(ray + k * 4 + 0xc0) = auVar165._0_4_;
                    uVar16 = vextractps_avx(auVar165,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar16;
                    uVar16 = vextractps_avx(auVar165,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar16;
                    *(float *)(ray + k * 4 + 0xf0) = fVar141;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar99;
                    *(uint *)(ray + k * 4 + 0x110) = uVar14;
                    *(uint *)(ray + k * 4 + 0x120) = uVar13;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    auVar165 = *local_708;
                    local_8a0 = ZEXT432(*(uint *)(ray + k * 4 + 0x80));
                    local_740._0_8_ = pGVar98;
                    while( true ) {
                      auVar126 = local_8a0;
                      local_420 = local_1a0[uVar93];
                      local_410 = *(undefined4 *)((long)&local_180 + uVar93 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar93 * 4);
                      fVar116 = 1.0 - local_420;
                      auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar116 * fVar116)),
                                               ZEXT416((uint)(local_420 * fVar116)),
                                               ZEXT416(0xc0000000));
                      auVar164 = vfmsub132ss_fma(ZEXT416((uint)(local_420 * fVar116)),
                                                 ZEXT416((uint)(local_420 * local_420)),
                                                 ZEXT416(0x40000000));
                      fVar141 = auVar164._0_4_ * 3.0;
                      fVar140 = local_420 * local_420 * 3.0;
                      auVar176._0_4_ = fVar140 * fVar115;
                      auVar176._4_4_ = fVar140 * fVar197;
                      auVar176._8_4_ = fVar140 * fVar203;
                      auVar176._12_4_ = fVar140 * fVar204;
                      auVar150._4_4_ = fVar141;
                      auVar150._0_4_ = fVar141;
                      auVar150._8_4_ = fVar141;
                      auVar150._12_4_ = fVar141;
                      auVar164 = vfmadd132ps_fma(auVar150,auVar176,auVar8);
                      fVar141 = auVar5._0_4_ * 3.0;
                      auVar170._4_4_ = fVar141;
                      auVar170._0_4_ = fVar141;
                      auVar170._8_4_ = fVar141;
                      auVar170._12_4_ = fVar141;
                      auVar164 = vfmadd132ps_fma(auVar170,auVar164,auVar122);
                      fVar141 = fVar116 * fVar116 * -3.0;
                      local_790.context = context->user;
                      auVar151._4_4_ = fVar141;
                      auVar151._0_4_ = fVar141;
                      auVar151._8_4_ = fVar141;
                      auVar151._12_4_ = fVar141;
                      auVar5 = vfmadd132ps_fma(auVar151,auVar164,auVar9);
                      local_450 = auVar5._0_4_;
                      uStack_44c = local_450;
                      uStack_448 = local_450;
                      uStack_444 = local_450;
                      auVar164 = vshufps_avx(auVar5,auVar5,0x55);
                      local_440 = auVar164;
                      local_430 = vshufps_avx(auVar5,auVar5,0xaa);
                      fStack_41c = local_420;
                      fStack_418 = local_420;
                      fStack_414 = local_420;
                      uStack_40c = local_410;
                      uStack_408 = local_410;
                      uStack_404 = local_410;
                      local_400 = CONCAT44(uStack_29c,local_2a0);
                      uStack_3f8 = CONCAT44(uStack_294,uStack_298);
                      local_3f0 = _local_690;
                      vpcmpeqd_avx2(ZEXT1632(_local_690),ZEXT1632(_local_690));
                      uStack_3dc = (local_790.context)->instID[0];
                      local_3e0 = uStack_3dc;
                      uStack_3d8 = uStack_3dc;
                      uStack_3d4 = uStack_3dc;
                      uStack_3d0 = (local_790.context)->instPrimID[0];
                      uStack_3cc = uStack_3d0;
                      uStack_3c8 = uStack_3d0;
                      uStack_3c4 = uStack_3d0;
                      local_790.valid = (int *)local_7e0;
                      local_790.geometryUserPtr = pGVar98->userPtr;
                      local_790.hit = (RTCHitN *)&local_450;
                      local_790.N = 4;
                      local_7e0 = auVar165;
                      local_790.ray = (RTCRayN *)ray;
                      if (pGVar98->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar213 = ZEXT1664(auVar213._0_16_);
                        (*pGVar98->intersectionFilterN)(&local_790);
                        pGVar98 = (Geometry *)local_740._0_8_;
                      }
                      if (local_7e0 == (undefined1  [16])0x0) {
                        auVar164 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                        auVar164 = auVar164 ^ _DAT_01f7ae20;
                      }
                      else {
                        p_Var20 = context->args->filter;
                        if ((p_Var20 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar98->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar213 = ZEXT1664(auVar213._0_16_);
                          (*p_Var20)(&local_790);
                          pGVar98 = (Geometry *)local_740._0_8_;
                        }
                        auVar5 = vpcmpeqd_avx(local_7e0,_DAT_01f7aa10);
                        auVar6 = vpcmpeqd_avx(auVar164,auVar164);
                        auVar164 = auVar5 ^ auVar6;
                        if (local_7e0 != (undefined1  [16])0x0) {
                          auVar5 = auVar5 ^ auVar6;
                          auVar6 = vmaskmovps_avx(auVar5,*(undefined1 (*) [16])local_790.hit);
                          *(undefined1 (*) [16])(local_790.ray + 0xc0) = auVar6;
                          auVar6 = vmaskmovps_avx(auVar5,*(undefined1 (*) [16])
                                                          (local_790.hit + 0x10));
                          *(undefined1 (*) [16])(local_790.ray + 0xd0) = auVar6;
                          auVar6 = vmaskmovps_avx(auVar5,*(undefined1 (*) [16])
                                                          (local_790.hit + 0x20));
                          *(undefined1 (*) [16])(local_790.ray + 0xe0) = auVar6;
                          auVar6 = vmaskmovps_avx(auVar5,*(undefined1 (*) [16])
                                                          (local_790.hit + 0x30));
                          *(undefined1 (*) [16])(local_790.ray + 0xf0) = auVar6;
                          auVar6 = vmaskmovps_avx(auVar5,*(undefined1 (*) [16])
                                                          (local_790.hit + 0x40));
                          *(undefined1 (*) [16])(local_790.ray + 0x100) = auVar6;
                          auVar6 = vmaskmovps_avx(auVar5,*(undefined1 (*) [16])
                                                          (local_790.hit + 0x50));
                          *(undefined1 (*) [16])(local_790.ray + 0x110) = auVar6;
                          auVar6 = vmaskmovps_avx(auVar5,*(undefined1 (*) [16])
                                                          (local_790.hit + 0x60));
                          *(undefined1 (*) [16])(local_790.ray + 0x120) = auVar6;
                          auVar6 = vmaskmovps_avx(auVar5,*(undefined1 (*) [16])
                                                          (local_790.hit + 0x70));
                          *(undefined1 (*) [16])(local_790.ray + 0x130) = auVar6;
                          auVar5 = vmaskmovps_avx(auVar5,*(undefined1 (*) [16])
                                                          (local_790.hit + 0x80));
                          *(undefined1 (*) [16])(local_790.ray + 0x140) = auVar5;
                        }
                      }
                      auVar127 = local_540;
                      auVar124._8_8_ = 0x100000001;
                      auVar124._0_8_ = 0x100000001;
                      if ((auVar124 & auVar164) == (undefined1  [16])0x0) {
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_8a0._0_4_;
                      }
                      else {
                        local_8a0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                        local_8a0._4_4_ = 0;
                        local_8a0._8_4_ = 0;
                        local_8a0._12_4_ = 0;
                      }
                      *(undefined4 *)(local_5a0 + uVar93 * 4) = 0;
                      local_8a0._16_16_ = auVar126._16_16_;
                      auVar113._4_4_ = local_8a0._0_4_;
                      auVar113._0_4_ = local_8a0._0_4_;
                      auVar113._8_4_ = local_8a0._0_4_;
                      auVar113._12_4_ = local_8a0._0_4_;
                      auVar113._16_4_ = local_8a0._0_4_;
                      auVar113._20_4_ = local_8a0._0_4_;
                      auVar113._24_4_ = local_8a0._0_4_;
                      auVar113._28_4_ = local_8a0._0_4_;
                      auVar183 = vcmpps_avx(auVar127,auVar113,2);
                      auVar126 = vandps_avx(auVar183,local_5a0);
                      local_5a0 = local_5a0 & auVar183;
                      if ((((((((local_5a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (local_5a0 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (local_5a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(local_5a0 >> 0x7f,0) == '\0') &&
                            (local_5a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(local_5a0 >> 0xbf,0) == '\0') &&
                          (local_5a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < local_5a0[0x1f]) break;
                      auVar138._8_4_ = 0x7f800000;
                      auVar138._0_8_ = 0x7f8000007f800000;
                      auVar138._12_4_ = 0x7f800000;
                      auVar138._16_4_ = 0x7f800000;
                      auVar138._20_4_ = 0x7f800000;
                      auVar138._24_4_ = 0x7f800000;
                      auVar138._28_4_ = 0x7f800000;
                      auVar127 = vblendvps_avx(auVar138,auVar127,auVar126);
                      auVar183 = vshufps_avx(auVar127,auVar127,0xb1);
                      auVar183 = vminps_avx(auVar127,auVar183);
                      auVar158 = vshufpd_avx(auVar183,auVar183,5);
                      auVar183 = vminps_avx(auVar183,auVar158);
                      auVar158 = vpermpd_avx2(auVar183,0x4e);
                      auVar183 = vminps_avx(auVar183,auVar158);
                      auVar183 = vcmpps_avx(auVar127,auVar183,0);
                      auVar158 = auVar126 & auVar183;
                      auVar127 = auVar126;
                      if ((((((((auVar158 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar158 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar158 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar158 >> 0x7f,0) != '\0') ||
                            (auVar158 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar158 >> 0xbf,0) != '\0') ||
                          (auVar158 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar158[0x1f] < '\0') {
                        auVar127 = vandps_avx(auVar183,auVar126);
                      }
                      uVar92 = vmovmskps_avx(auVar127);
                      uVar94 = 0;
                      for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
                        uVar94 = uVar94 + 1;
                      }
                      uVar93 = (ulong)uVar94;
                      local_5a0 = auVar126;
                    }
                    auVar202 = ZEXT3264(local_6c0);
                    auVar209 = ZEXT3264(local_7c0);
                    prim = local_7d0;
                  }
                }
              }
            }
          }
          lVar97 = lVar97 + 8;
        } while ((int)lVar97 < iVar15);
      }
      uVar99 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar111._4_4_ = uVar99;
      auVar111._0_4_ = uVar99;
      auVar111._8_4_ = uVar99;
      auVar111._12_4_ = uVar99;
      auVar111._16_4_ = uVar99;
      auVar111._20_4_ = uVar99;
      auVar111._24_4_ = uVar99;
      auVar111._28_4_ = uVar99;
      auVar126 = vcmpps_avx(local_80,auVar111,2);
      uVar94 = vmovmskps_avx(auVar126);
      uVar91 = uVar91 & uVar91 + 0xff & uVar94;
    } while (uVar91 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }